

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  ulong uVar48;
  long lVar50;
  byte bVar51;
  uint uVar52;
  ulong uVar53;
  ulong uVar54;
  uint uVar55;
  ulong uVar56;
  undefined4 uVar57;
  undefined8 in_R9;
  bool bVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar88;
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar89;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined8 uVar90;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  float fVar118;
  vint4 ai_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  vint4 ai;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar144;
  float fVar158;
  float fVar159;
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar160;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  vint4 ai_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar190;
  float fVar191;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  vfloat4 a0_2;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar213;
  vfloat4 a0_3;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  vfloat4 a0_1;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar233;
  float fVar242;
  float fVar243;
  vfloat4 a0;
  undefined1 auVar235 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar244;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar263 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_52c;
  undefined1 local_528 [8];
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  ulong local_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [32];
  ulong local_3a8;
  Primitive *local_3a0;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 auStack_388 [16];
  undefined1 local_378 [32];
  RTCFilterFunctionNArguments local_358;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  uint auStack_2e8 [4];
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined8 local_2cc;
  undefined4 local_2c4;
  undefined4 local_2c0;
  uint local_2bc;
  uint local_2b8;
  undefined1 local_2a8 [32];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint uStack_1d8;
  float afStack_1d4 [7];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  ulong uVar49;
  undefined1 auVar262 [32];
  
  PVar3 = prim[1];
  uVar48 = (ulong)(byte)PVar3;
  fVar59 = *(float *)(prim + uVar48 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar48 * 0x19 + 6));
  auVar161._0_4_ = fVar59 * (ray->dir).field_0.m128[0];
  auVar161._4_4_ = fVar59 * (ray->dir).field_0.m128[1];
  auVar161._8_4_ = fVar59 * (ray->dir).field_0.m128[2];
  auVar161._12_4_ = fVar59 * (ray->dir).field_0.m128[3];
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 4 + 6)));
  auVar62._0_4_ = fVar59 * auVar12._0_4_;
  auVar62._4_4_ = fVar59 * auVar12._4_4_;
  auVar62._8_4_ = fVar59 * auVar12._8_4_;
  auVar62._12_4_ = fVar59 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xb + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xc + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xd + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x12 + 6)));
  auVar235 = vcvtdq2ps_avx(auVar235);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x13 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x14 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar228 = vcvtdq2ps_avx(auVar228);
  auVar252._4_4_ = auVar161._0_4_;
  auVar252._0_4_ = auVar161._0_4_;
  auVar252._8_4_ = auVar161._0_4_;
  auVar252._12_4_ = auVar161._0_4_;
  auVar106 = vshufps_avx(auVar161,auVar161,0x55);
  auVar63 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar59 = auVar63._0_4_;
  auVar214._0_4_ = fVar59 * auVar126._0_4_;
  fVar88 = auVar63._4_4_;
  auVar214._4_4_ = fVar88 * auVar126._4_4_;
  fVar118 = auVar63._8_4_;
  auVar214._8_4_ = fVar118 * auVar126._8_4_;
  fVar89 = auVar63._12_4_;
  auVar214._12_4_ = fVar89 * auVar126._12_4_;
  auVar200._0_4_ = auVar235._0_4_ * fVar59;
  auVar200._4_4_ = auVar235._4_4_ * fVar88;
  auVar200._8_4_ = auVar235._8_4_ * fVar118;
  auVar200._12_4_ = auVar235._12_4_ * fVar89;
  auVar192._0_4_ = auVar228._0_4_ * fVar59;
  auVar192._4_4_ = auVar228._4_4_ * fVar88;
  auVar192._8_4_ = auVar228._8_4_ * fVar118;
  auVar192._12_4_ = auVar228._12_4_ * fVar89;
  auVar63 = vfmadd231ps_fma(auVar214,auVar106,auVar12);
  auVar123 = vfmadd231ps_fma(auVar200,auVar106,auVar11);
  auVar106 = vfmadd231ps_fma(auVar192,auVar64,auVar106);
  auVar119 = vfmadd231ps_fma(auVar63,auVar252,auVar9);
  auVar123 = vfmadd231ps_fma(auVar123,auVar252,auVar10);
  auVar132 = vfmadd231ps_fma(auVar106,auVar65,auVar252);
  auVar253._4_4_ = auVar62._0_4_;
  auVar253._0_4_ = auVar62._0_4_;
  auVar253._8_4_ = auVar62._0_4_;
  auVar253._12_4_ = auVar62._0_4_;
  auVar106 = vshufps_avx(auVar62,auVar62,0x55);
  auVar63 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar59 = auVar63._0_4_;
  auVar162._0_4_ = fVar59 * auVar126._0_4_;
  fVar88 = auVar63._4_4_;
  auVar162._4_4_ = fVar88 * auVar126._4_4_;
  fVar118 = auVar63._8_4_;
  auVar162._8_4_ = fVar118 * auVar126._8_4_;
  fVar89 = auVar63._12_4_;
  auVar162._12_4_ = fVar89 * auVar126._12_4_;
  auVar91._0_4_ = auVar235._0_4_ * fVar59;
  auVar91._4_4_ = auVar235._4_4_ * fVar88;
  auVar91._8_4_ = auVar235._8_4_ * fVar118;
  auVar91._12_4_ = auVar235._12_4_ * fVar89;
  auVar63._0_4_ = auVar228._0_4_ * fVar59;
  auVar63._4_4_ = auVar228._4_4_ * fVar88;
  auVar63._8_4_ = auVar228._8_4_ * fVar118;
  auVar63._12_4_ = auVar228._12_4_ * fVar89;
  auVar12 = vfmadd231ps_fma(auVar162,auVar106,auVar12);
  auVar126 = vfmadd231ps_fma(auVar91,auVar106,auVar11);
  auVar11 = vfmadd231ps_fma(auVar63,auVar106,auVar64);
  auVar64 = vfmadd231ps_fma(auVar12,auVar253,auVar9);
  auVar228 = vfmadd231ps_fma(auVar126,auVar253,auVar10);
  local_318._8_4_ = 0x7fffffff;
  local_318._0_8_ = 0x7fffffff7fffffff;
  local_318._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar119,local_318);
  auVar178._8_4_ = 0x219392ef;
  auVar178._0_8_ = 0x219392ef219392ef;
  auVar178._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar178,1);
  auVar12 = vblendvps_avx(auVar119,auVar178,auVar9);
  auVar9 = vandps_avx(auVar123,local_318);
  auVar9 = vcmpps_avx(auVar9,auVar178,1);
  auVar126 = vblendvps_avx(auVar123,auVar178,auVar9);
  auVar9 = vandps_avx(auVar132,local_318);
  auVar9 = vcmpps_avx(auVar9,auVar178,1);
  auVar9 = vblendvps_avx(auVar132,auVar178,auVar9);
  auVar106 = vfmadd231ps_fma(auVar11,auVar253,auVar65);
  auVar10 = vrcpps_avx(auVar12);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar10,auVar179);
  auVar10 = vfmadd132ps_fma(auVar12,auVar10,auVar10);
  auVar12 = vrcpps_avx(auVar126);
  auVar126 = vfnmadd213ps_fma(auVar126,auVar12,auVar179);
  auVar235 = vfmadd132ps_fma(auVar126,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar12,auVar179);
  auVar65 = vfmadd132ps_fma(auVar9,auVar12,auVar12);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar48 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar64);
  auVar132._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar132._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar132._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar132._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar48 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar64);
  auVar145._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar145._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar145._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar145._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar48 * 0xe + 6);
  auVar9 = vpmovsxwd_avx(auVar126);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar228);
  auVar163._0_4_ = auVar235._0_4_ * auVar9._0_4_;
  auVar163._4_4_ = auVar235._4_4_ * auVar9._4_4_;
  auVar163._8_4_ = auVar235._8_4_ * auVar9._8_4_;
  auVar163._12_4_ = auVar235._12_4_ * auVar9._12_4_;
  auVar123._1_3_ = 0;
  auVar123[0] = PVar3;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar12 = vsubps_avx(auVar9,auVar228);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar48 * 0x15 + 6);
  auVar9 = vpmovsxwd_avx(auVar11);
  auVar228._0_4_ = auVar235._0_4_ * auVar12._0_4_;
  auVar228._4_4_ = auVar235._4_4_ * auVar12._4_4_;
  auVar228._8_4_ = auVar235._8_4_ * auVar12._8_4_;
  auVar228._12_4_ = auVar235._12_4_ * auVar12._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar106);
  auVar119._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar119._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar119._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar119._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar48 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar235);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar106);
  auVar64._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar132,auVar145);
  auVar12 = vpminsd_avx(auVar163,auVar228);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vpminsd_avx(auVar119,auVar64);
  uVar57 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar201._4_4_ = uVar57;
  auVar201._0_4_ = uVar57;
  auVar201._8_4_ = uVar57;
  auVar201._12_4_ = uVar57;
  auVar12 = vmaxps_avx(auVar12,auVar201);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  local_248._0_4_ = auVar9._0_4_ * 0.99999964;
  local_248._4_4_ = auVar9._4_4_ * 0.99999964;
  local_248._8_4_ = auVar9._8_4_ * 0.99999964;
  local_248._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar132,auVar145);
  auVar12 = vpmaxsd_avx(auVar163,auVar228);
  auVar9 = vminps_avx(auVar9,auVar12);
  auVar12 = vpmaxsd_avx(auVar119,auVar64);
  fVar59 = ray->tfar;
  auVar106._4_4_ = fVar59;
  auVar106._0_4_ = fVar59;
  auVar106._8_4_ = fVar59;
  auVar106._12_4_ = fVar59;
  auVar12 = vminps_avx(auVar12,auVar106);
  auVar9 = vminps_avx(auVar9,auVar12);
  auVar65._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar123[4] = PVar3;
  auVar123._5_3_ = 0;
  auVar123[8] = PVar3;
  auVar123._9_3_ = 0;
  auVar123[0xc] = PVar3;
  auVar123._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar123,_DAT_01f4ad30);
  auVar9 = vcmpps_avx(local_248,auVar65,2);
  auVar9 = vandps_avx(auVar9,auVar12);
  uVar57 = vmovmskps_avx(auVar9);
  uVar48 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar57);
  auVar85._16_16_ = mm_lookupmask_ps._240_16_;
  auVar85._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,0x80);
  local_3a0 = prim;
LAB_01106077:
  if (uVar48 == 0) {
LAB_01107b8e:
    return uVar48 != 0;
  }
  lVar50 = 0;
  for (uVar54 = uVar48; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  local_4d0 = (ulong)*(uint *)(local_3a0 + 2);
  local_3a8 = (ulong)*(uint *)(local_3a0 + lVar50 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_4d0].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_3a8);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar9 = *(undefined1 (*) [16])(_Var7 + uVar53 * (long)pvVar6);
  auVar12 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 1) * (long)pvVar6);
  auVar126 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 2) * (long)pvVar6);
  auVar10 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar53 + 3));
  lVar50 = *(long *)&pGVar4[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * uVar53);
  auVar235 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * (uVar53 + 1));
  auVar65 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * (uVar53 + 2));
  uVar54 = uVar48 - 1 & uVar48;
  auVar64 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * (uVar53 + 3));
  if (uVar54 != 0) {
    uVar56 = uVar54 - 1 & uVar54;
    for (uVar53 = uVar54; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar56 != 0) {
      for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar123 = ZEXT816(0) << 0x40;
  auVar66._0_4_ = auVar64._0_4_ * 0.0;
  auVar66._4_4_ = auVar64._4_4_ * 0.0;
  auVar66._8_4_ = auVar64._8_4_ * 0.0;
  auVar66._12_4_ = auVar64._12_4_ * 0.0;
  auVar106 = vfmadd231ps_fma(auVar66,auVar65,auVar123);
  auVar228 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar235,auVar106);
  local_528._0_4_ = auVar11._0_4_ + auVar228._0_4_;
  local_528._4_4_ = auVar11._4_4_ + auVar228._4_4_;
  uStack_520._0_4_ = auVar11._8_4_ + auVar228._8_4_;
  uStack_520._4_4_ = auVar11._12_4_ + auVar228._12_4_;
  auVar245._8_4_ = 0x40400000;
  auVar245._0_8_ = 0x4040000040400000;
  auVar245._12_4_ = 0x40400000;
  auVar228 = vfmadd231ps_fma(auVar106,auVar235,auVar245);
  auVar63 = vfnmadd231ps_fma(auVar228,auVar11,auVar245);
  auVar226._0_4_ = auVar10._0_4_ * 0.0;
  auVar226._4_4_ = auVar10._4_4_ * 0.0;
  auVar226._8_4_ = auVar10._8_4_ * 0.0;
  auVar226._12_4_ = auVar10._12_4_ * 0.0;
  auVar106 = vfmadd231ps_fma(auVar226,auVar126,auVar123);
  auVar228 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar106);
  auVar234._0_4_ = auVar9._0_4_ + auVar228._0_4_;
  auVar234._4_4_ = auVar9._4_4_ + auVar228._4_4_;
  auVar234._8_4_ = auVar9._8_4_ + auVar228._8_4_;
  auVar234._12_4_ = auVar9._12_4_ + auVar228._12_4_;
  auVar228 = vfmadd231ps_fma(auVar106,auVar12,auVar245);
  auVar106 = vfnmadd231ps_fma(auVar228,auVar9,auVar245);
  auVar228 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar65,auVar64);
  auVar228 = vfmadd231ps_fma(auVar228,auVar235,auVar123);
  auVar228 = vfmadd231ps_fma(auVar228,auVar11,auVar123);
  auVar120._0_4_ = auVar64._0_4_ * 3.0;
  auVar120._4_4_ = auVar64._4_4_ * 3.0;
  auVar120._8_4_ = auVar64._8_4_ * 3.0;
  auVar120._12_4_ = auVar64._12_4_ * 3.0;
  auVar65 = vfnmadd231ps_fma(auVar120,auVar245,auVar65);
  auVar235 = vfmadd231ps_fma(auVar65,auVar123,auVar235);
  auVar65 = vfnmadd231ps_fma(auVar235,auVar123,auVar11);
  auVar11 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar126,auVar10);
  auVar11 = vfmadd231ps_fma(auVar11,auVar12,auVar123);
  auVar11 = vfmadd231ps_fma(auVar11,auVar9,auVar123);
  auVar202._0_4_ = auVar10._0_4_ * 3.0;
  auVar202._4_4_ = auVar10._4_4_ * 3.0;
  auVar202._8_4_ = auVar10._8_4_ * 3.0;
  auVar202._12_4_ = auVar10._12_4_ * 3.0;
  auVar126 = vfnmadd231ps_fma(auVar202,auVar245,auVar126);
  auVar12 = vfmadd231ps_fma(auVar126,auVar123,auVar12);
  auVar235 = vfnmadd231ps_fma(auVar12,auVar123,auVar9);
  auVar9 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar12 = vshufps_avx(auVar234,auVar234,0xc9);
  fVar60 = auVar63._0_4_;
  auVar146._0_4_ = fVar60 * auVar12._0_4_;
  fVar61 = auVar63._4_4_;
  auVar146._4_4_ = fVar61 * auVar12._4_4_;
  fVar144 = auVar63._8_4_;
  auVar146._8_4_ = fVar144 * auVar12._8_4_;
  fVar213 = auVar63._12_4_;
  auVar146._12_4_ = fVar213 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar146,auVar9,auVar234);
  auVar126 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar147._0_4_ = fVar60 * auVar12._0_4_;
  auVar147._4_4_ = fVar61 * auVar12._4_4_;
  auVar147._8_4_ = fVar144 * auVar12._8_4_;
  auVar147._12_4_ = fVar213 * auVar12._12_4_;
  auVar9 = vfmsub231ps_fma(auVar147,auVar9,auVar106);
  auVar10 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar12 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar117 = auVar65._0_4_;
  auVar133._0_4_ = fVar117 * auVar9._0_4_;
  fVar177 = auVar65._4_4_;
  auVar133._4_4_ = fVar177 * auVar9._4_4_;
  fVar190 = auVar65._8_4_;
  auVar133._8_4_ = fVar190 * auVar9._8_4_;
  fVar191 = auVar65._12_4_;
  auVar133._12_4_ = fVar191 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar133,auVar12,auVar11);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar235,auVar235,0xc9);
  auVar164._0_4_ = fVar117 * auVar9._0_4_;
  auVar164._4_4_ = fVar177 * auVar9._4_4_;
  auVar164._8_4_ = fVar190 * auVar9._8_4_;
  auVar164._12_4_ = fVar191 * auVar9._12_4_;
  auVar9 = vdpps_avx(auVar126,auVar126,0x7f);
  auVar12 = vfmsub231ps_fma(auVar164,auVar12,auVar235);
  auVar235 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar88 = auVar9._0_4_;
  auVar203._4_12_ = ZEXT812(0) << 0x20;
  auVar203._0_4_ = fVar88;
  auVar12 = vrsqrtss_avx(auVar203,auVar203);
  fVar59 = auVar12._0_4_;
  fVar118 = fVar59 * 1.5 - fVar88 * 0.5 * fVar59 * fVar59 * fVar59;
  fVar143 = fVar118 * auVar126._0_4_;
  fVar158 = fVar118 * auVar126._4_4_;
  fVar159 = fVar118 * auVar126._8_4_;
  fVar160 = fVar118 * auVar126._12_4_;
  auVar12 = vdpps_avx(auVar126,auVar10,0x7f);
  auVar215._0_4_ = auVar10._0_4_ * fVar88;
  auVar215._4_4_ = auVar10._4_4_ * fVar88;
  auVar215._8_4_ = auVar10._8_4_ * fVar88;
  auVar215._12_4_ = auVar10._12_4_ * fVar88;
  fVar59 = auVar12._0_4_;
  auVar180._0_4_ = fVar59 * auVar126._0_4_;
  auVar180._4_4_ = fVar59 * auVar126._4_4_;
  auVar180._8_4_ = fVar59 * auVar126._8_4_;
  auVar180._12_4_ = fVar59 * auVar126._12_4_;
  auVar126 = vsubps_avx(auVar215,auVar180);
  auVar12 = vrcpss_avx(auVar203,auVar203);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar59 = auVar12._0_4_ * auVar9._0_4_;
  auVar9 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar88 = auVar9._0_4_;
  auVar193._4_12_ = ZEXT812(0) << 0x20;
  auVar193._0_4_ = fVar88;
  auVar12 = vrsqrtss_avx(auVar193,auVar193);
  fVar89 = auVar12._0_4_;
  fVar89 = fVar89 * 1.5 - fVar88 * 0.5 * fVar89 * fVar89 * fVar89;
  auVar12 = vdpps_avx(auVar11,auVar235,0x7f);
  fVar233 = fVar89 * auVar11._0_4_;
  fVar242 = fVar89 * auVar11._4_4_;
  fVar243 = fVar89 * auVar11._8_4_;
  fVar244 = fVar89 * auVar11._12_4_;
  auVar165._0_4_ = fVar88 * auVar235._0_4_;
  auVar165._4_4_ = fVar88 * auVar235._4_4_;
  auVar165._8_4_ = fVar88 * auVar235._8_4_;
  auVar165._12_4_ = fVar88 * auVar235._12_4_;
  fVar88 = auVar12._0_4_;
  auVar134._0_4_ = fVar88 * auVar11._0_4_;
  auVar134._4_4_ = fVar88 * auVar11._4_4_;
  auVar134._8_4_ = fVar88 * auVar11._8_4_;
  auVar134._12_4_ = fVar88 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar165,auVar134);
  auVar12 = vrcpss_avx(auVar193,auVar193);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar12,ZEXT416(0x40000000));
  fVar88 = auVar9._0_4_ * auVar12._0_4_;
  auVar9 = vshufps_avx(_local_528,_local_528,0xff);
  auVar194._0_4_ = auVar9._0_4_ * fVar143;
  auVar194._4_4_ = auVar9._4_4_ * fVar158;
  auVar194._8_4_ = auVar9._8_4_ * fVar159;
  auVar194._12_4_ = auVar9._12_4_ * fVar160;
  local_458 = vsubps_avx(_local_528,auVar194);
  auVar12 = vshufps_avx(auVar63,auVar63,0xff);
  auVar148._0_4_ = auVar12._0_4_ * fVar143 + auVar9._0_4_ * fVar118 * fVar59 * auVar126._0_4_;
  auVar148._4_4_ = auVar12._4_4_ * fVar158 + auVar9._4_4_ * fVar118 * fVar59 * auVar126._4_4_;
  auVar148._8_4_ = auVar12._8_4_ * fVar159 + auVar9._8_4_ * fVar118 * fVar59 * auVar126._8_4_;
  auVar148._12_4_ = auVar12._12_4_ * fVar160 + auVar9._12_4_ * fVar118 * fVar59 * auVar126._12_4_;
  auVar126 = vsubps_avx(auVar63,auVar148);
  local_468._0_4_ = auVar194._0_4_ + (float)local_528._0_4_;
  local_468._4_4_ = auVar194._4_4_ + (float)local_528._4_4_;
  fStack_460 = auVar194._8_4_ + (float)uStack_520;
  fStack_45c = auVar194._12_4_ + uStack_520._4_4_;
  auVar9 = vshufps_avx(auVar228,auVar228,0xff);
  auVar92._0_4_ = fVar233 * auVar9._0_4_;
  auVar92._4_4_ = fVar242 * auVar9._4_4_;
  auVar92._8_4_ = fVar243 * auVar9._8_4_;
  auVar92._12_4_ = fVar244 * auVar9._12_4_;
  local_478 = vsubps_avx(auVar228,auVar92);
  auVar12 = vshufps_avx(auVar65,auVar65,0xff);
  auVar67._0_4_ = fVar233 * auVar12._0_4_ + auVar9._0_4_ * fVar89 * auVar10._0_4_ * fVar88;
  auVar67._4_4_ = fVar242 * auVar12._4_4_ + auVar9._4_4_ * fVar89 * auVar10._4_4_ * fVar88;
  auVar67._8_4_ = fVar243 * auVar12._8_4_ + auVar9._8_4_ * fVar89 * auVar10._8_4_ * fVar88;
  auVar67._12_4_ = fVar244 * auVar12._12_4_ + auVar9._12_4_ * fVar89 * auVar10._12_4_ * fVar88;
  auVar9 = vsubps_avx(auVar65,auVar67);
  local_4c8 = auVar228._0_4_ + auVar92._0_4_;
  fStack_4c4 = auVar228._4_4_ + auVar92._4_4_;
  fStack_4c0 = auVar228._8_4_ + auVar92._8_4_;
  fStack_4bc = auVar228._12_4_ + auVar92._12_4_;
  local_488._0_4_ = local_458._0_4_ + auVar126._0_4_ * 0.33333334;
  local_488._4_4_ = local_458._4_4_ + auVar126._4_4_ * 0.33333334;
  local_488._8_4_ = local_458._8_4_ + auVar126._8_4_ * 0.33333334;
  local_488._12_4_ = local_458._12_4_ + auVar126._12_4_ * 0.33333334;
  auVar68._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar68._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar68._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar68._12_4_ = auVar9._12_4_ * 0.33333334;
  local_498 = vsubps_avx(local_478,auVar68);
  aVar1 = (ray->org).field_0;
  auVar126 = vsubps_avx(local_458,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar126,auVar126,0x55);
  auVar12 = vshufps_avx(auVar126,auVar126,0xaa);
  aVar2 = (pre->ray_space).vy.field_0;
  fVar59 = (pre->ray_space).vz.field_0.m128[0];
  fVar88 = (pre->ray_space).vz.field_0.m128[1];
  fVar118 = (pre->ray_space).vz.field_0.m128[2];
  fVar89 = (pre->ray_space).vz.field_0.m128[3];
  auVar135._0_4_ = fVar59 * auVar12._0_4_;
  auVar135._4_4_ = fVar88 * auVar12._4_4_;
  auVar135._8_4_ = fVar118 * auVar12._8_4_;
  auVar135._12_4_ = fVar89 * auVar12._12_4_;
  auVar106 = vfmadd231ps_fma(auVar135,(undefined1  [16])aVar2,auVar9);
  auVar10 = vsubps_avx(local_488,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar10,auVar10,0x55);
  auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar69._0_4_ = fVar59 * auVar12._0_4_;
  auVar69._4_4_ = fVar88 * auVar12._4_4_;
  auVar69._8_4_ = fVar118 * auVar12._8_4_;
  auVar69._12_4_ = fVar89 * auVar12._12_4_;
  auVar63 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar2,auVar9);
  auVar12 = vsubps_avx(local_498,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar107._0_4_ = fVar59 * auVar9._0_4_;
  auVar107._4_4_ = fVar88 * auVar9._4_4_;
  auVar107._8_4_ = fVar118 * auVar9._8_4_;
  auVar107._12_4_ = fVar89 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar12,auVar12,0x55);
  auVar123 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar2,auVar9);
  auVar11 = vsubps_avx(local_478,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar121._0_4_ = fVar59 * auVar9._0_4_;
  auVar121._4_4_ = fVar88 * auVar9._4_4_;
  auVar121._8_4_ = fVar118 * auVar9._8_4_;
  auVar121._12_4_ = fVar89 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar11,auVar11,0x55);
  auVar119 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar2,auVar9);
  auVar235 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar235,auVar235,0xaa);
  auVar93._0_4_ = fVar59 * auVar9._0_4_;
  auVar93._4_4_ = fVar88 * auVar9._4_4_;
  auVar93._8_4_ = fVar118 * auVar9._8_4_;
  auVar93._12_4_ = fVar89 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar235,auVar235,0x55);
  auVar132 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar2,auVar9);
  local_4a8._0_4_ = (fVar60 + auVar148._0_4_) * 0.33333334 + (float)local_468._0_4_;
  local_4a8._4_4_ = (fVar61 + auVar148._4_4_) * 0.33333334 + (float)local_468._4_4_;
  fStack_4a0 = (fVar144 + auVar148._8_4_) * 0.33333334 + fStack_460;
  fStack_49c = (fVar213 + auVar148._12_4_) * 0.33333334 + fStack_45c;
  auVar65 = vsubps_avx(_local_4a8,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar227._0_4_ = fVar59 * auVar9._0_4_;
  auVar227._4_4_ = fVar88 * auVar9._4_4_;
  auVar227._8_4_ = fVar118 * auVar9._8_4_;
  auVar227._12_4_ = fVar89 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar65,auVar65,0x55);
  auVar62 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar2,auVar9);
  auVar216._0_4_ = (fVar117 + auVar67._0_4_) * 0.33333334;
  auVar216._4_4_ = (fVar177 + auVar67._4_4_) * 0.33333334;
  auVar216._8_4_ = (fVar190 + auVar67._8_4_) * 0.33333334;
  auVar216._12_4_ = (fVar191 + auVar67._12_4_) * 0.33333334;
  auVar42._4_4_ = fStack_4c4;
  auVar42._0_4_ = local_4c8;
  auVar42._8_4_ = fStack_4c0;
  auVar42._12_4_ = fStack_4bc;
  _local_4b8 = vsubps_avx(auVar42,auVar216);
  auVar64 = vsubps_avx(_local_4b8,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar217._0_4_ = fVar59 * auVar9._0_4_;
  auVar217._4_4_ = fVar88 * auVar9._4_4_;
  auVar217._8_4_ = fVar118 * auVar9._8_4_;
  auVar217._12_4_ = fVar89 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar64,auVar64,0x55);
  auVar91 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar9);
  auVar228 = vsubps_avx(auVar42,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar228,auVar228,0xaa);
  auVar181._0_4_ = fVar59 * auVar9._0_4_;
  auVar181._4_4_ = fVar88 * auVar9._4_4_;
  auVar181._8_4_ = fVar118 * auVar9._8_4_;
  auVar181._12_4_ = fVar89 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar228,auVar228,0x55);
  auVar9 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar2,auVar9);
  local_528._0_4_ = auVar126._0_4_;
  auVar166._4_4_ = local_528._0_4_;
  auVar166._0_4_ = local_528._0_4_;
  auVar166._8_4_ = local_528._0_4_;
  auVar166._12_4_ = local_528._0_4_;
  aVar2 = (pre->ray_space).vx.field_0;
  auVar106 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar2,auVar166);
  local_4e8._0_4_ = auVar10._0_4_;
  auVar167._4_4_ = local_4e8._0_4_;
  auVar167._0_4_ = local_4e8._0_4_;
  auVar167._8_4_ = local_4e8._0_4_;
  auVar167._12_4_ = local_4e8._0_4_;
  auVar10 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar167);
  uVar57 = auVar12._0_4_;
  auVar168._4_4_ = uVar57;
  auVar168._0_4_ = uVar57;
  auVar168._8_4_ = uVar57;
  auVar168._12_4_ = uVar57;
  auVar63 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar2,auVar168);
  uVar57 = auVar11._0_4_;
  auVar169._4_4_ = uVar57;
  auVar169._0_4_ = uVar57;
  auVar169._8_4_ = uVar57;
  auVar169._12_4_ = uVar57;
  auVar11 = vfmadd231ps_fma(auVar119,(undefined1  [16])aVar2,auVar169);
  uVar57 = auVar235._0_4_;
  auVar170._4_4_ = uVar57;
  auVar170._0_4_ = uVar57;
  auVar170._8_4_ = uVar57;
  auVar170._12_4_ = uVar57;
  auVar235 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar2,auVar170);
  uVar57 = auVar65._0_4_;
  auVar171._4_4_ = uVar57;
  auVar171._0_4_ = uVar57;
  auVar171._8_4_ = uVar57;
  auVar171._12_4_ = uVar57;
  auVar65 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar171);
  uVar57 = auVar64._0_4_;
  auVar70._4_4_ = uVar57;
  auVar70._0_4_ = uVar57;
  auVar70._8_4_ = uVar57;
  auVar70._12_4_ = uVar57;
  auVar64 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar2,auVar70);
  uVar57 = auVar228._0_4_;
  auVar71._4_4_ = uVar57;
  auVar71._0_4_ = uVar57;
  auVar71._8_4_ = uVar57;
  auVar71._12_4_ = uVar57;
  auVar228 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar71);
  local_4e8 = vmovlhps_avx(auVar106,auVar235);
  local_4f8 = vmovlhps_avx(auVar10,auVar65);
  local_508 = vmovlhps_avx(auVar63,auVar64);
  _local_218 = vmovlhps_avx(auVar11,auVar228);
  auVar9 = vminps_avx(local_4e8,local_4f8);
  auVar12 = vminps_avx(local_508,_local_218);
  auVar126 = vminps_avx(auVar9,auVar12);
  auVar9 = vmaxps_avx(local_4e8,local_4f8);
  auVar12 = vmaxps_avx(local_508,_local_218);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vshufpd_avx(auVar126,auVar126,3);
  auVar126 = vminps_avx(auVar126,auVar12);
  auVar12 = vshufpd_avx(auVar9,auVar9,3);
  auVar12 = vmaxps_avx(auVar9,auVar12);
  auVar9 = vandps_avx(local_318,auVar126);
  auVar12 = vandps_avx(local_318,auVar12);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar12,auVar9);
  local_78 = auVar9._0_4_ * 9.536743e-07;
  local_3d8._0_8_ = auVar106._0_8_;
  local_3d8._8_8_ = local_3d8._0_8_;
  local_3e8._0_8_ = auVar10._0_8_;
  local_3e8._8_8_ = local_3e8._0_8_;
  local_3f8._8_8_ = auVar63._0_8_;
  local_3f8._0_8_ = auVar63._0_8_;
  local_408._8_8_ = auVar11._0_8_;
  local_408._0_8_ = auVar11._0_8_;
  register0x00001388 = auVar235._0_8_;
  local_418 = auVar235._0_8_;
  local_428 = auVar65._0_8_;
  register0x000014c8 = local_428;
  local_438 = auVar64._0_8_;
  register0x00001488 = local_438;
  register0x000012c8 = auVar228._0_8_;
  local_448 = auVar228._0_8_;
  local_228 = ZEXT416((uint)local_78);
  local_328 = 0x80000000;
  uStack_324 = 0x80000000;
  uStack_320 = 0x80000000;
  uStack_31c = 0x80000000;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fStack_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = local_78;
  fStack_5c = local_78;
  fStack_90 = -local_78;
  local_98 = -local_78;
  fStack_94 = -local_78;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar58 = false;
  uVar53 = 0;
  local_1e8 = vsubps_avx(local_4f8,local_4e8);
  local_1f8 = vsubps_avx(local_508,local_4f8);
  local_208 = vsubps_avx(_local_218,local_508);
  local_258 = vsubps_avx(_local_468,local_458);
  local_268 = vsubps_avx(_local_4a8,local_488);
  local_278 = vsubps_avx(_local_4b8,local_498);
  auVar43._4_4_ = fStack_4c4;
  auVar43._0_4_ = local_4c8;
  auVar43._8_4_ = fStack_4c0;
  auVar43._12_4_ = fStack_4bc;
  _local_288 = vsubps_avx(auVar43,local_478);
  auVar72 = ZEXT816(0x3f80000000000000);
  local_238 = auVar72;
LAB_011067b7:
  auVar9 = vshufps_avx(auVar72,auVar72,0x50);
  auVar259._8_4_ = 0x3f800000;
  auVar259._0_8_ = 0x3f8000003f800000;
  auVar259._12_4_ = 0x3f800000;
  auVar262._16_4_ = 0x3f800000;
  auVar262._0_16_ = auVar259;
  auVar262._20_4_ = 0x3f800000;
  auVar262._24_4_ = 0x3f800000;
  auVar262._28_4_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar259,auVar9);
  fVar59 = auVar9._0_4_;
  auVar73._0_4_ = local_418._0_4_ * fVar59;
  fVar88 = auVar9._4_4_;
  auVar73._4_4_ = local_418._4_4_ * fVar88;
  fVar118 = auVar9._8_4_;
  auVar73._8_4_ = local_418._8_4_ * fVar118;
  fVar89 = auVar9._12_4_;
  auVar73._12_4_ = local_418._12_4_ * fVar89;
  auVar172._0_4_ = local_428._0_4_ * fVar59;
  auVar172._4_4_ = local_428._4_4_ * fVar88;
  auVar172._8_4_ = local_428._8_4_ * fVar118;
  auVar172._12_4_ = local_428._12_4_ * fVar89;
  auVar136._0_4_ = local_438._0_4_ * fVar59;
  auVar136._4_4_ = local_438._4_4_ * fVar88;
  auVar136._8_4_ = local_438._8_4_ * fVar118;
  auVar136._12_4_ = local_438._12_4_ * fVar89;
  auVar108._0_4_ = local_448._0_4_ * fVar59;
  auVar108._4_4_ = local_448._4_4_ * fVar88;
  auVar108._8_4_ = local_448._8_4_ * fVar118;
  auVar108._12_4_ = local_448._12_4_ * fVar89;
  auVar11 = vfmadd231ps_fma(auVar73,auVar12,local_3d8);
  auVar235 = vfmadd231ps_fma(auVar172,auVar12,local_3e8);
  auVar65 = vfmadd231ps_fma(auVar136,auVar12,local_3f8);
  auVar64 = vfmadd231ps_fma(auVar108,local_408,auVar12);
  auVar9 = vmovshdup_avx(local_238);
  fVar59 = local_238._0_4_;
  fStack_140 = (auVar9._0_4_ - fVar59) * 0.04761905;
  auVar211._4_4_ = fVar59;
  auVar211._0_4_ = fVar59;
  auVar211._8_4_ = fVar59;
  auVar211._12_4_ = fVar59;
  auVar211._16_4_ = fVar59;
  auVar211._20_4_ = fVar59;
  auVar211._24_4_ = fVar59;
  auVar211._28_4_ = fVar59;
  auVar103._0_8_ = auVar9._0_8_;
  auVar103._8_8_ = auVar103._0_8_;
  auVar103._16_8_ = auVar103._0_8_;
  auVar103._24_8_ = auVar103._0_8_;
  auVar85 = vsubps_avx(auVar103,auVar211);
  uVar57 = auVar11._0_4_;
  auVar257._4_4_ = uVar57;
  auVar257._0_4_ = uVar57;
  auVar257._8_4_ = uVar57;
  auVar257._12_4_ = uVar57;
  auVar257._16_4_ = uVar57;
  auVar257._20_4_ = uVar57;
  auVar257._24_4_ = uVar57;
  auVar257._28_4_ = uVar57;
  auVar9 = vmovshdup_avx(auVar11);
  uVar90 = auVar9._0_8_;
  auVar251._8_8_ = uVar90;
  auVar251._0_8_ = uVar90;
  auVar251._16_8_ = uVar90;
  auVar251._24_8_ = uVar90;
  fVar117 = auVar235._0_4_;
  auVar239._4_4_ = fVar117;
  auVar239._0_4_ = fVar117;
  auVar239._8_4_ = fVar117;
  auVar239._12_4_ = fVar117;
  auVar239._16_4_ = fVar117;
  auVar239._20_4_ = fVar117;
  auVar239._24_4_ = fVar117;
  auVar239._28_4_ = fVar117;
  auVar12 = vmovshdup_avx(auVar235);
  auVar104._0_8_ = auVar12._0_8_;
  auVar104._8_8_ = auVar104._0_8_;
  auVar104._16_8_ = auVar104._0_8_;
  auVar104._24_8_ = auVar104._0_8_;
  fVar213 = auVar65._0_4_;
  auVar187._4_4_ = fVar213;
  auVar187._0_4_ = fVar213;
  auVar187._8_4_ = fVar213;
  auVar187._12_4_ = fVar213;
  auVar187._16_4_ = fVar213;
  auVar187._20_4_ = fVar213;
  auVar187._24_4_ = fVar213;
  auVar187._28_4_ = fVar213;
  auVar126 = vmovshdup_avx(auVar65);
  auVar198._0_8_ = auVar126._0_8_;
  auVar198._8_8_ = auVar198._0_8_;
  auVar198._16_8_ = auVar198._0_8_;
  auVar198._24_8_ = auVar198._0_8_;
  fVar144 = auVar64._0_4_;
  auVar10 = vmovshdup_avx(auVar64);
  auVar228 = vfmadd132ps_fma(auVar85,auVar211,_DAT_01f7b040);
  auVar85 = vsubps_avx(auVar262,ZEXT1632(auVar228));
  fVar59 = auVar228._0_4_;
  fVar88 = auVar228._4_4_;
  auVar13._4_4_ = fVar117 * fVar88;
  auVar13._0_4_ = fVar117 * fVar59;
  fVar118 = auVar228._8_4_;
  auVar13._8_4_ = fVar117 * fVar118;
  fVar89 = auVar228._12_4_;
  auVar13._12_4_ = fVar117 * fVar89;
  auVar13._16_4_ = fVar117 * 0.0;
  auVar13._20_4_ = fVar117 * 0.0;
  auVar13._24_4_ = fVar117 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar228 = vfmadd231ps_fma(auVar13,auVar85,auVar257);
  fVar60 = auVar12._0_4_;
  fVar61 = auVar12._4_4_;
  auVar14._4_4_ = fVar61 * fVar88;
  auVar14._0_4_ = fVar60 * fVar59;
  auVar14._8_4_ = fVar60 * fVar118;
  auVar14._12_4_ = fVar61 * fVar89;
  auVar14._16_4_ = fVar60 * 0.0;
  auVar14._20_4_ = fVar61 * 0.0;
  auVar14._24_4_ = fVar60 * 0.0;
  auVar14._28_4_ = uVar57;
  auVar106 = vfmadd231ps_fma(auVar14,auVar85,auVar251);
  auVar15._4_4_ = fVar213 * fVar88;
  auVar15._0_4_ = fVar213 * fVar59;
  auVar15._8_4_ = fVar213 * fVar118;
  auVar15._12_4_ = fVar213 * fVar89;
  auVar15._16_4_ = fVar213 * 0.0;
  auVar15._20_4_ = fVar213 * 0.0;
  auVar15._24_4_ = fVar213 * 0.0;
  auVar15._28_4_ = auVar9._4_4_;
  auVar63 = vfmadd231ps_fma(auVar15,auVar85,auVar239);
  fVar60 = auVar126._0_4_;
  fVar61 = auVar126._4_4_;
  auVar8._4_4_ = fVar61 * fVar88;
  auVar8._0_4_ = fVar60 * fVar59;
  auVar8._8_4_ = fVar60 * fVar118;
  auVar8._12_4_ = fVar61 * fVar89;
  auVar8._16_4_ = fVar60 * 0.0;
  auVar8._20_4_ = fVar61 * 0.0;
  auVar8._24_4_ = fVar60 * 0.0;
  auVar8._28_4_ = fVar117;
  auVar123 = vfmadd231ps_fma(auVar8,auVar85,auVar104);
  auVar9 = vshufps_avx(auVar11,auVar11,0xaa);
  local_3c8._8_8_ = auVar9._0_8_;
  local_3c8._0_8_ = local_3c8._8_8_;
  local_3c8._16_8_ = local_3c8._8_8_;
  local_3c8._24_8_ = local_3c8._8_8_;
  auVar12 = vshufps_avx(auVar11,auVar11,0xff);
  uStack_520 = auVar12._0_8_;
  local_528 = (undefined1  [8])uStack_520;
  uStack_518 = uStack_520;
  uStack_510 = uStack_520;
  auVar241._4_4_ = fVar144 * fVar88;
  auVar241._0_4_ = fVar144 * fVar59;
  auVar241._8_4_ = fVar144 * fVar118;
  auVar241._12_4_ = fVar144 * fVar89;
  auVar241._16_4_ = fVar144 * 0.0;
  auVar241._20_4_ = fVar144 * 0.0;
  auVar241._24_4_ = fVar144 * 0.0;
  auVar241._28_4_ = fVar144;
  auVar11 = vfmadd231ps_fma(auVar241,auVar85,auVar187);
  auVar12 = vshufps_avx(auVar235,auVar235,0xaa);
  auVar188._0_8_ = auVar12._0_8_;
  auVar188._8_8_ = auVar188._0_8_;
  auVar188._16_8_ = auVar188._0_8_;
  auVar188._24_8_ = auVar188._0_8_;
  auVar126 = vshufps_avx(auVar235,auVar235,0xff);
  local_378._8_8_ = auVar126._0_8_;
  local_378._0_8_ = local_378._8_8_;
  local_378._16_8_ = local_378._8_8_;
  local_378._24_8_ = local_378._8_8_;
  fVar60 = auVar10._0_4_;
  fVar61 = auVar10._4_4_;
  auVar17._4_4_ = fVar61 * fVar88;
  auVar17._0_4_ = fVar60 * fVar59;
  auVar17._8_4_ = fVar60 * fVar118;
  auVar17._12_4_ = fVar61 * fVar89;
  auVar17._16_4_ = fVar60 * 0.0;
  auVar17._20_4_ = fVar61 * 0.0;
  auVar17._24_4_ = fVar60 * 0.0;
  auVar17._28_4_ = auVar9._4_4_;
  auVar119 = vfmadd231ps_fma(auVar17,auVar85,auVar198);
  auVar18._28_4_ = fVar61;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(auVar63._12_4_ * fVar89,
                          CONCAT48(auVar63._8_4_ * fVar118,
                                   CONCAT44(auVar63._4_4_ * fVar88,auVar63._0_4_ * fVar59))));
  auVar228 = vfmadd231ps_fma(auVar18,auVar85,ZEXT1632(auVar228));
  fVar60 = auVar126._4_4_;
  auVar19._28_4_ = fVar60;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar123._12_4_ * fVar89,
                          CONCAT48(auVar123._8_4_ * fVar118,
                                   CONCAT44(auVar123._4_4_ * fVar88,auVar123._0_4_ * fVar59))));
  auVar106 = vfmadd231ps_fma(auVar19,auVar85,ZEXT1632(auVar106));
  auVar9 = vshufps_avx(auVar65,auVar65,0xaa);
  uVar90 = auVar9._0_8_;
  auVar176._8_8_ = uVar90;
  auVar176._0_8_ = uVar90;
  auVar176._16_8_ = uVar90;
  auVar176._24_8_ = uVar90;
  auVar10 = vshufps_avx(auVar65,auVar65,0xff);
  uVar90 = auVar10._0_8_;
  auVar263._8_8_ = uVar90;
  auVar263._0_8_ = uVar90;
  auVar263._16_8_ = uVar90;
  auVar263._24_8_ = uVar90;
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar89,
                                               CONCAT48(auVar11._8_4_ * fVar118,
                                                        CONCAT44(auVar11._4_4_ * fVar88,
                                                                 auVar11._0_4_ * fVar59)))),auVar85,
                            ZEXT1632(auVar63));
  auVar11 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar235 = vshufps_avx(auVar64,auVar64,0xff);
  auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar89 * auVar119._12_4_,
                                               CONCAT48(fVar118 * auVar119._8_4_,
                                                        CONCAT44(fVar88 * auVar119._4_4_,
                                                                 fVar59 * auVar119._0_4_)))),auVar85
                            ,ZEXT1632(auVar123));
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar89 * auVar65._12_4_,
                                               CONCAT48(fVar118 * auVar65._8_4_,
                                                        CONCAT44(fVar88 * auVar65._4_4_,
                                                                 fVar59 * auVar65._0_4_)))),auVar85,
                            ZEXT1632(auVar228));
  auVar13 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar228));
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar89 * auVar64._12_4_,
                                               CONCAT48(fVar118 * auVar64._8_4_,
                                                        CONCAT44(fVar88 * auVar64._4_4_,
                                                                 fVar59 * auVar64._0_4_)))),auVar85,
                            ZEXT1632(auVar106));
  auVar14 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar106));
  fVar61 = auVar14._28_4_;
  auVar240._0_4_ = fStack_140 * auVar13._0_4_ * 3.0;
  auVar240._4_4_ = fStack_140 * auVar13._4_4_ * 3.0;
  auVar240._8_4_ = fStack_140 * auVar13._8_4_ * 3.0;
  auVar240._12_4_ = fStack_140 * auVar13._12_4_ * 3.0;
  auVar240._16_4_ = fStack_140 * auVar13._16_4_ * 3.0;
  auVar240._20_4_ = fStack_140 * auVar13._20_4_ * 3.0;
  auVar240._24_4_ = fStack_140 * auVar13._24_4_ * 3.0;
  auVar240._28_4_ = 0;
  local_308._0_4_ = fStack_140 * auVar14._0_4_ * 3.0;
  local_308._4_4_ = fStack_140 * auVar14._4_4_ * 3.0;
  fStack_300 = fStack_140 * auVar14._8_4_ * 3.0;
  fStack_2fc = fStack_140 * auVar14._12_4_ * 3.0;
  fStack_2f8 = fStack_140 * auVar14._16_4_ * 3.0;
  fStack_2f4 = fStack_140 * auVar14._20_4_ * 3.0;
  fStack_2f0 = fStack_140 * auVar14._24_4_ * 3.0;
  fStack_2ec = fVar61;
  fVar144 = auVar12._0_4_;
  fVar213 = auVar12._4_4_;
  auVar20._4_4_ = fVar213 * fVar88;
  auVar20._0_4_ = fVar144 * fVar59;
  auVar20._8_4_ = fVar144 * fVar118;
  auVar20._12_4_ = fVar213 * fVar89;
  auVar20._16_4_ = fVar144 * 0.0;
  auVar20._20_4_ = fVar213 * 0.0;
  auVar20._24_4_ = fVar144 * 0.0;
  auVar20._28_4_ = fVar61;
  auVar12 = vfmadd231ps_fma(auVar20,auVar85,local_3c8);
  fVar144 = auVar126._0_4_;
  auVar21._4_4_ = fVar60 * fVar88;
  auVar21._0_4_ = fVar144 * fVar59;
  auVar21._8_4_ = fVar144 * fVar118;
  auVar21._12_4_ = fVar60 * fVar89;
  auVar21._16_4_ = fVar144 * 0.0;
  auVar21._20_4_ = fVar60 * 0.0;
  auVar21._24_4_ = fVar144 * 0.0;
  auVar21._28_4_ = 0;
  auVar126 = vfmadd231ps_fma(auVar21,auVar85,_local_528);
  fVar60 = auVar9._0_4_;
  fVar144 = auVar9._4_4_;
  auVar22._4_4_ = fVar144 * fVar88;
  auVar22._0_4_ = fVar60 * fVar59;
  auVar22._8_4_ = fVar60 * fVar118;
  auVar22._12_4_ = fVar144 * fVar89;
  auVar22._16_4_ = fVar60 * 0.0;
  auVar22._20_4_ = fVar144 * 0.0;
  auVar22._24_4_ = fVar60 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar9 = vfmadd231ps_fma(auVar22,auVar85,auVar188);
  fVar60 = auVar10._0_4_;
  fVar117 = auVar10._4_4_;
  auVar23._4_4_ = fVar117 * fVar88;
  auVar23._0_4_ = fVar60 * fVar59;
  auVar23._8_4_ = fVar60 * fVar118;
  auVar23._12_4_ = fVar117 * fVar89;
  auVar23._16_4_ = fVar60 * 0.0;
  auVar23._20_4_ = fVar117 * 0.0;
  auVar23._24_4_ = fVar60 * 0.0;
  auVar23._28_4_ = fVar213;
  auVar10 = vfmadd231ps_fma(auVar23,auVar85,local_378);
  local_378 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar63));
  fVar60 = auVar11._0_4_;
  fVar144 = auVar11._4_4_;
  auVar24._4_4_ = fVar144 * fVar88;
  auVar24._0_4_ = fVar60 * fVar59;
  auVar24._8_4_ = fVar60 * fVar118;
  auVar24._12_4_ = fVar144 * fVar89;
  auVar24._16_4_ = fVar60 * 0.0;
  auVar24._20_4_ = fVar144 * 0.0;
  auVar24._24_4_ = fVar60 * 0.0;
  auVar24._28_4_ = fVar144;
  auVar11 = vfmadd231ps_fma(auVar24,auVar85,auVar176);
  _local_528 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar65));
  fVar60 = auVar235._0_4_;
  fVar144 = auVar235._4_4_;
  auVar25._4_4_ = fVar144 * fVar88;
  auVar25._0_4_ = fVar60 * fVar59;
  auVar25._8_4_ = fVar60 * fVar118;
  auVar25._12_4_ = fVar144 * fVar89;
  auVar25._16_4_ = fVar60 * 0.0;
  auVar25._20_4_ = fVar144 * 0.0;
  auVar25._24_4_ = fVar60 * 0.0;
  auVar25._28_4_ = fVar144;
  auVar235 = vfmadd231ps_fma(auVar25,auVar85,auVar263);
  auVar26._28_4_ = fVar117;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar9._12_4_ * fVar89,
                          CONCAT48(auVar9._8_4_ * fVar118,
                                   CONCAT44(auVar9._4_4_ * fVar88,auVar9._0_4_ * fVar59))));
  auVar12 = vfmadd231ps_fma(auVar26,auVar85,ZEXT1632(auVar12));
  auVar126 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar89 * auVar10._12_4_,
                                                CONCAT48(fVar118 * auVar10._8_4_,
                                                         CONCAT44(fVar88 * auVar10._4_4_,
                                                                  fVar59 * auVar10._0_4_)))),auVar85
                             ,ZEXT1632(auVar126));
  local_3c8._0_4_ = auVar63._0_4_ + auVar240._0_4_;
  local_3c8._4_4_ = auVar63._4_4_ + auVar240._4_4_;
  local_3c8._8_4_ = auVar63._8_4_ + auVar240._8_4_;
  local_3c8._12_4_ = auVar63._12_4_ + auVar240._12_4_;
  local_3c8._16_4_ = auVar240._16_4_ + 0.0;
  local_3c8._20_4_ = auVar240._20_4_ + 0.0;
  local_3c8._24_4_ = auVar240._24_4_ + 0.0;
  local_3c8._28_4_ = 0;
  auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar89,
                                              CONCAT48(auVar11._8_4_ * fVar118,
                                                       CONCAT44(auVar11._4_4_ * fVar88,
                                                                auVar11._0_4_ * fVar59)))),auVar85,
                           ZEXT1632(auVar9));
  auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar235._12_4_ * fVar89,
                                               CONCAT48(auVar235._8_4_ * fVar118,
                                                        CONCAT44(auVar235._4_4_ * fVar88,
                                                                 auVar235._0_4_ * fVar59)))),auVar85
                            ,ZEXT1632(auVar10));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar89 * auVar9._12_4_,
                                               CONCAT48(fVar118 * auVar9._8_4_,
                                                        CONCAT44(fVar88 * auVar9._4_4_,
                                                                 fVar59 * auVar9._0_4_)))),auVar85,
                            ZEXT1632(auVar12));
  auVar235 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar10._12_4_ * fVar89,
                                                CONCAT48(auVar10._8_4_ * fVar118,
                                                         CONCAT44(auVar10._4_4_ * fVar88,
                                                                  auVar10._0_4_ * fVar59)))),
                             ZEXT1632(auVar126),auVar85);
  auVar85 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
  auVar13 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar126));
  auVar258._0_4_ = fStack_140 * auVar85._0_4_ * 3.0;
  auVar258._4_4_ = fStack_140 * auVar85._4_4_ * 3.0;
  auVar258._8_4_ = fStack_140 * auVar85._8_4_ * 3.0;
  auVar258._12_4_ = fStack_140 * auVar85._12_4_ * 3.0;
  auVar258._16_4_ = fStack_140 * auVar85._16_4_ * 3.0;
  auVar258._20_4_ = fStack_140 * auVar85._20_4_ * 3.0;
  auVar258._24_4_ = fStack_140 * auVar85._24_4_ * 3.0;
  auVar258._28_4_ = 0;
  local_158 = fStack_140 * auVar13._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_154;
  auVar27._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_140;
  auVar27._28_4_ = 0x40400000;
  _local_398 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar11));
  local_2a8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar235));
  auVar85 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar63));
  auVar13 = vsubps_avx(ZEXT1632(auVar235),ZEXT1632(auVar65));
  auVar14 = vsubps_avx(_local_398,local_378);
  fVar177 = auVar85._0_4_ + auVar14._0_4_;
  fVar190 = auVar85._4_4_ + auVar14._4_4_;
  fVar191 = auVar85._8_4_ + auVar14._8_4_;
  fVar143 = auVar85._12_4_ + auVar14._12_4_;
  fVar158 = auVar85._16_4_ + auVar14._16_4_;
  fVar159 = auVar85._20_4_ + auVar14._20_4_;
  fVar160 = auVar85._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(local_2a8,_local_528);
  auVar86._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar86._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar86._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar86._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar86._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar86._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar86._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar86._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_f8 = ZEXT1632(auVar65);
  fVar59 = auVar65._0_4_;
  local_178 = (float)local_308._0_4_ + fVar59;
  fVar88 = auVar65._4_4_;
  fStack_174 = (float)local_308._4_4_ + fVar88;
  fVar118 = auVar65._8_4_;
  fStack_170 = fStack_300 + fVar118;
  fVar89 = auVar65._12_4_;
  fStack_16c = fStack_2fc + fVar89;
  fStack_168 = fStack_2f8 + 0.0;
  fStack_164 = fStack_2f4 + 0.0;
  fStack_160 = fStack_2f0 + 0.0;
  local_b8 = ZEXT1632(auVar63);
  auVar13 = vsubps_avx(local_b8,auVar240);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar13 = vsubps_avx(local_f8,_local_308);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar13);
  local_118._0_4_ = auVar11._0_4_ + auVar258._0_4_;
  local_118._4_4_ = auVar11._4_4_ + auVar258._4_4_;
  local_118._8_4_ = auVar11._8_4_ + auVar258._8_4_;
  local_118._12_4_ = auVar11._12_4_ + auVar258._12_4_;
  local_118._16_4_ = auVar258._16_4_ + 0.0;
  local_118._20_4_ = auVar258._20_4_ + 0.0;
  local_118._24_4_ = auVar258._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar241 = ZEXT1632(auVar11);
  auVar13 = vsubps_avx(auVar241,auVar258);
  _local_308 = vpermps_avx2(_DAT_01fb7720,auVar13);
  fVar60 = auVar235._0_4_;
  local_158 = fVar60 + local_158;
  fVar144 = auVar235._4_4_;
  fStack_154 = fVar144 + fStack_154;
  fVar213 = auVar235._8_4_;
  fStack_150 = fVar213 + fStack_150;
  fVar117 = auVar235._12_4_;
  fStack_14c = fVar117 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar235),auVar27);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar28._4_4_ = fVar88 * fVar190;
  auVar28._0_4_ = fVar59 * fVar177;
  auVar28._8_4_ = fVar118 * fVar191;
  auVar28._12_4_ = fVar89 * fVar143;
  auVar28._16_4_ = fVar158 * 0.0;
  auVar28._20_4_ = fVar159 * 0.0;
  auVar28._24_4_ = fVar160 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar9 = vfnmadd231ps_fma(auVar28,local_b8,auVar86);
  fStack_15c = fVar61 + 0.0;
  auVar29._4_4_ = fStack_174 * fVar190;
  auVar29._0_4_ = local_178 * fVar177;
  auVar29._8_4_ = fStack_170 * fVar191;
  auVar29._12_4_ = fStack_16c * fVar143;
  auVar29._16_4_ = fStack_168 * fVar158;
  auVar29._20_4_ = fStack_164 * fVar159;
  auVar29._24_4_ = fStack_160 * fVar160;
  auVar29._28_4_ = 0;
  auVar12 = vfnmadd231ps_fma(auVar29,auVar86,local_3c8);
  auVar30._4_4_ = local_198._4_4_ * fVar190;
  auVar30._0_4_ = local_198._0_4_ * fVar177;
  auVar30._8_4_ = local_198._8_4_ * fVar191;
  auVar30._12_4_ = local_198._12_4_ * fVar143;
  auVar30._16_4_ = local_198._16_4_ * fVar158;
  auVar30._20_4_ = local_198._20_4_ * fVar159;
  auVar30._24_4_ = local_198._24_4_ * fVar160;
  auVar30._28_4_ = fVar61 + 0.0;
  auVar126 = vfnmadd231ps_fma(auVar30,local_d8,auVar86);
  auVar31._4_4_ = (float)local_528._4_4_ * fVar190;
  auVar31._0_4_ = (float)local_528._0_4_ * fVar177;
  auVar31._8_4_ = (float)uStack_520 * fVar191;
  auVar31._12_4_ = uStack_520._4_4_ * fVar143;
  auVar31._16_4_ = (float)uStack_518 * fVar158;
  auVar31._20_4_ = uStack_518._4_4_ * fVar159;
  auVar31._24_4_ = (float)uStack_510 * fVar160;
  auVar31._28_4_ = uStack_510._4_4_;
  auVar10 = vfnmadd231ps_fma(auVar31,local_378,auVar86);
  auVar199._0_4_ = fVar60 * fVar177;
  auVar199._4_4_ = fVar144 * fVar190;
  auVar199._8_4_ = fVar213 * fVar191;
  auVar199._12_4_ = fVar117 * fVar143;
  auVar199._16_4_ = fVar158 * 0.0;
  auVar199._20_4_ = fVar159 * 0.0;
  auVar199._24_4_ = fVar160 * 0.0;
  auVar199._28_4_ = 0;
  auVar11 = vfnmadd231ps_fma(auVar199,auVar241,auVar86);
  uStack_13c = 0x40400000;
  auVar32._4_4_ = fStack_154 * fVar190;
  auVar32._0_4_ = local_158 * fVar177;
  auVar32._8_4_ = fStack_150 * fVar191;
  auVar32._12_4_ = fStack_14c * fVar143;
  auVar32._16_4_ = fStack_148 * fVar158;
  auVar32._20_4_ = fStack_144 * fVar159;
  auVar32._24_4_ = fStack_140 * fVar160;
  auVar32._28_4_ = local_378._28_4_;
  auVar65 = vfnmadd231ps_fma(auVar32,local_118,auVar86);
  auVar33._4_4_ = local_138._4_4_ * fVar190;
  auVar33._0_4_ = local_138._0_4_ * fVar177;
  auVar33._8_4_ = local_138._8_4_ * fVar191;
  auVar33._12_4_ = local_138._12_4_ * fVar143;
  auVar33._16_4_ = local_138._16_4_ * fVar158;
  auVar33._20_4_ = local_138._20_4_ * fVar159;
  auVar33._24_4_ = local_138._24_4_ * fVar160;
  auVar33._28_4_ = local_138._28_4_;
  auVar64 = vfnmadd231ps_fma(auVar33,_local_308,auVar86);
  auVar34._4_4_ = local_2a8._4_4_ * fVar190;
  auVar34._0_4_ = local_2a8._0_4_ * fVar177;
  auVar34._8_4_ = local_2a8._8_4_ * fVar191;
  auVar34._12_4_ = local_2a8._12_4_ * fVar143;
  auVar34._16_4_ = local_2a8._16_4_ * fVar158;
  auVar34._20_4_ = local_2a8._20_4_ * fVar159;
  auVar34._24_4_ = local_2a8._24_4_ * fVar160;
  auVar34._28_4_ = auVar85._28_4_ + auVar14._28_4_;
  auVar212 = ZEXT3264(_local_398);
  auVar228 = vfnmadd231ps_fma(auVar34,_local_398,auVar86);
  auVar13 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
  auVar85 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
  auVar14 = vminps_avx(ZEXT1632(auVar126),ZEXT1632(auVar10));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar126),ZEXT1632(auVar10));
  auVar85 = vmaxps_avx(auVar85,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
  auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
  auVar8 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar228));
  auVar15 = vminps_avx(auVar15,auVar8);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar228));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar85,auVar13);
  auVar46._4_4_ = fStack_74;
  auVar46._0_4_ = local_78;
  auVar46._8_4_ = fStack_70;
  auVar46._12_4_ = fStack_6c;
  auVar46._16_4_ = fStack_68;
  auVar46._20_4_ = fStack_64;
  auVar46._24_4_ = fStack_60;
  auVar46._28_4_ = fStack_5c;
  auVar85 = vcmpps_avx(auVar15,auVar46,2);
  auVar45._4_4_ = fStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = fStack_90;
  auVar45._12_4_ = fStack_8c;
  auVar45._16_4_ = fStack_88;
  auVar45._20_4_ = fStack_84;
  auVar45._24_4_ = fStack_80;
  auVar45._28_4_ = fStack_7c;
  auVar13 = vcmpps_avx(auVar13,auVar45,5);
  auVar85 = vandps_avx(auVar13,auVar85);
  auVar13 = local_1b8 & auVar85;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_378,local_b8);
    auVar14 = vsubps_avx(_local_398,auVar241);
    fVar177 = auVar13._0_4_ + auVar14._0_4_;
    fVar190 = auVar13._4_4_ + auVar14._4_4_;
    fVar191 = auVar13._8_4_ + auVar14._8_4_;
    fVar143 = auVar13._12_4_ + auVar14._12_4_;
    fVar158 = auVar13._16_4_ + auVar14._16_4_;
    fVar159 = auVar13._20_4_ + auVar14._20_4_;
    fVar160 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(_local_528,local_f8);
    auVar8 = vsubps_avx(local_2a8,ZEXT1632(auVar235));
    auVar105._0_4_ = auVar15._0_4_ + auVar8._0_4_;
    auVar105._4_4_ = auVar15._4_4_ + auVar8._4_4_;
    auVar105._8_4_ = auVar15._8_4_ + auVar8._8_4_;
    auVar105._12_4_ = auVar15._12_4_ + auVar8._12_4_;
    auVar105._16_4_ = auVar15._16_4_ + auVar8._16_4_;
    auVar105._20_4_ = auVar15._20_4_ + auVar8._20_4_;
    auVar105._24_4_ = auVar15._24_4_ + auVar8._24_4_;
    fVar61 = auVar8._28_4_;
    auVar105._28_4_ = auVar15._28_4_ + fVar61;
    auVar35._4_4_ = fVar88 * fVar190;
    auVar35._0_4_ = fVar59 * fVar177;
    auVar35._8_4_ = fVar118 * fVar191;
    auVar35._12_4_ = fVar89 * fVar143;
    auVar35._16_4_ = fVar158 * 0.0;
    auVar35._20_4_ = fVar159 * 0.0;
    auVar35._24_4_ = fVar160 * 0.0;
    auVar35._28_4_ = local_2a8._28_4_;
    auVar11 = vfnmadd231ps_fma(auVar35,auVar105,local_b8);
    auVar36._4_4_ = fVar190 * fStack_174;
    auVar36._0_4_ = fVar177 * local_178;
    auVar36._8_4_ = fVar191 * fStack_170;
    auVar36._12_4_ = fVar143 * fStack_16c;
    auVar36._16_4_ = fVar158 * fStack_168;
    auVar36._20_4_ = fVar159 * fStack_164;
    auVar36._24_4_ = fVar160 * fStack_160;
    auVar36._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_3c8,auVar105,auVar36);
    auVar37._4_4_ = fVar190 * local_198._4_4_;
    auVar37._0_4_ = fVar177 * local_198._0_4_;
    auVar37._8_4_ = fVar191 * local_198._8_4_;
    auVar37._12_4_ = fVar143 * local_198._12_4_;
    auVar37._16_4_ = fVar158 * local_198._16_4_;
    auVar37._20_4_ = fVar159 * local_198._20_4_;
    auVar37._24_4_ = fVar160 * local_198._24_4_;
    auVar37._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(local_d8,auVar105,auVar37);
    auVar38._4_4_ = (float)local_528._4_4_ * fVar190;
    auVar38._0_4_ = (float)local_528._0_4_ * fVar177;
    auVar38._8_4_ = (float)uStack_520 * fVar191;
    auVar38._12_4_ = uStack_520._4_4_ * fVar143;
    auVar38._16_4_ = (float)uStack_518 * fVar158;
    auVar38._20_4_ = uStack_518._4_4_ * fVar159;
    auVar38._24_4_ = (float)uStack_510 * fVar160;
    auVar38._28_4_ = 0;
    auVar235 = vfnmadd231ps_fma(auVar38,auVar105,local_378);
    auVar130._0_4_ = fVar60 * fVar177;
    auVar130._4_4_ = fVar144 * fVar190;
    auVar130._8_4_ = fVar213 * fVar191;
    auVar130._12_4_ = fVar117 * fVar143;
    auVar130._16_4_ = fVar158 * 0.0;
    auVar130._20_4_ = fVar159 * 0.0;
    auVar130._24_4_ = fVar160 * 0.0;
    auVar130._28_4_ = 0;
    auVar65 = vfnmadd231ps_fma(auVar130,auVar105,auVar241);
    auVar39._4_4_ = fVar190 * fStack_154;
    auVar39._0_4_ = fVar177 * local_158;
    auVar39._8_4_ = fVar191 * fStack_150;
    auVar39._12_4_ = fVar143 * fStack_14c;
    auVar39._16_4_ = fVar158 * fStack_148;
    auVar39._20_4_ = fVar159 * fStack_144;
    auVar39._24_4_ = fVar160 * fStack_140;
    auVar39._28_4_ = fVar61;
    auVar126 = vfnmadd213ps_fma(local_118,auVar105,auVar39);
    auVar40._4_4_ = fVar190 * local_138._4_4_;
    auVar40._0_4_ = fVar177 * local_138._0_4_;
    auVar40._8_4_ = fVar191 * local_138._8_4_;
    auVar40._12_4_ = fVar143 * local_138._12_4_;
    auVar40._16_4_ = fVar158 * local_138._16_4_;
    auVar40._20_4_ = fVar159 * local_138._20_4_;
    auVar40._24_4_ = fVar160 * local_138._24_4_;
    auVar40._28_4_ = fVar61;
    auVar10 = vfnmadd213ps_fma(_local_308,auVar105,auVar40);
    auVar212 = ZEXT1664(auVar10);
    auVar41._4_4_ = fVar190 * local_2a8._4_4_;
    auVar41._0_4_ = fVar177 * local_2a8._0_4_;
    auVar41._8_4_ = fVar191 * local_2a8._8_4_;
    auVar41._12_4_ = fVar143 * local_2a8._12_4_;
    auVar41._16_4_ = fVar158 * local_2a8._16_4_;
    auVar41._20_4_ = fVar159 * local_2a8._20_4_;
    auVar41._24_4_ = fVar160 * local_2a8._24_4_;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar64 = vfnmadd231ps_fma(auVar41,auVar105,_local_398);
    auVar14 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar9));
    auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar9));
    auVar15 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar235));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar235));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar8 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar126));
    auVar14 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar126));
    auVar241 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar64));
    auVar8 = vminps_avx(auVar8,auVar241);
    auVar8 = vminps_avx(auVar15,auVar8);
    auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar64));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar8,auVar46,2);
    auVar14 = vcmpps_avx(auVar14,auVar45,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar85 = vandps_avx(auVar85,local_1b8);
    auVar14 = auVar85 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar85 = vandps_avx(auVar13,auVar85);
      uVar55 = vmovmskps_avx(auVar85);
      if (uVar55 != 0) {
        auStack_2e8[uVar53] = uVar55 & 0xff;
        uVar90 = vmovlps_avx(local_238);
        *(undefined8 *)(&uStack_1d8 + uVar53 * 2) = uVar90;
        uVar56 = vmovlps_avx(auVar72);
        auStack_58[uVar53] = uVar56;
        uVar53 = (ulong)((int)uVar53 + 1);
      }
    }
  }
LAB_01106d66:
  if ((int)uVar53 != 0) {
    uVar47 = (int)uVar53 - 1;
    uVar49 = (ulong)uVar47;
    uVar52 = auStack_2e8[uVar49];
    uVar55 = (&uStack_1d8)[uVar49 * 2];
    fVar59 = afStack_1d4[uVar49 * 2];
    iVar16 = 0;
    for (uVar56 = (ulong)uVar52; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      iVar16 = iVar16 + 1;
    }
    uVar52 = uVar52 - 1 & uVar52;
    if (uVar52 == 0) {
      uVar53 = (ulong)uVar47;
    }
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_58[uVar49];
    auStack_2e8[uVar49] = uVar52;
    fVar88 = (float)(iVar16 + 1) * 0.14285715;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * (float)iVar16 * 0.14285715)),ZEXT416(uVar55),
                             ZEXT416((uint)(1.0 - (float)iVar16 * 0.14285715)));
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar88)),ZEXT416(uVar55),
                              ZEXT416((uint)(1.0 - fVar88)));
    fVar88 = auVar12._0_4_;
    auVar189._0_4_ = auVar9._0_4_;
    fVar59 = fVar88 - auVar189._0_4_;
    if (fVar59 < 0.16666667) {
      auVar126 = vshufps_avx(auVar72,auVar72,0x50);
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = 0x3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar10 = vsubps_avx(auVar94,auVar126);
      fVar118 = auVar126._0_4_;
      auVar137._0_4_ = fVar118 * (float)local_418._0_4_;
      fVar89 = auVar126._4_4_;
      auVar137._4_4_ = fVar89 * (float)local_418._4_4_;
      fVar60 = auVar126._8_4_;
      auVar137._8_4_ = fVar60 * fStack_410;
      fVar61 = auVar126._12_4_;
      auVar137._12_4_ = fVar61 * fStack_40c;
      auVar149._0_4_ = fVar118 * (float)local_428._0_4_;
      auVar149._4_4_ = fVar89 * (float)local_428._4_4_;
      auVar149._8_4_ = fVar60 * fStack_420;
      auVar149._12_4_ = fVar61 * fStack_41c;
      auVar173._0_4_ = fVar118 * (float)local_438._0_4_;
      auVar173._4_4_ = fVar89 * (float)local_438._4_4_;
      auVar173._8_4_ = fVar60 * fStack_430;
      auVar173._12_4_ = fVar61 * fStack_42c;
      auVar74._0_4_ = fVar118 * (float)local_448._0_4_;
      auVar74._4_4_ = fVar89 * (float)local_448._4_4_;
      auVar74._8_4_ = fVar60 * fStack_440;
      auVar74._12_4_ = fVar61 * fStack_43c;
      auVar126 = vfmadd231ps_fma(auVar137,auVar10,local_3d8);
      auVar11 = vfmadd231ps_fma(auVar149,auVar10,local_3e8);
      auVar235 = vfmadd231ps_fma(auVar173,auVar10,local_3f8);
      auVar10 = vfmadd231ps_fma(auVar74,auVar10,local_408);
      auVar131._16_16_ = auVar126;
      auVar131._0_16_ = auVar126;
      auVar142._16_16_ = auVar11;
      auVar142._0_16_ = auVar11;
      auVar157._16_16_ = auVar235;
      auVar157._0_16_ = auVar235;
      _local_528 = auVar9;
      auVar189._4_4_ = auVar189._0_4_;
      auVar189._8_4_ = auVar189._0_4_;
      auVar189._12_4_ = auVar189._0_4_;
      local_3c8._0_16_ = auVar12;
      auVar189._20_4_ = fVar88;
      auVar189._16_4_ = fVar88;
      auVar189._24_4_ = fVar88;
      auVar189._28_4_ = fVar88;
      auVar85 = vsubps_avx(auVar142,auVar131);
      auVar11 = vfmadd213ps_fma(auVar85,auVar189,auVar131);
      auVar85 = vsubps_avx(auVar157,auVar142);
      auVar65 = vfmadd213ps_fma(auVar85,auVar189,auVar142);
      auVar126 = vsubps_avx(auVar10,auVar235);
      auVar87._16_16_ = auVar126;
      auVar87._0_16_ = auVar126;
      auVar126 = vfmadd213ps_fma(auVar87,auVar189,auVar157);
      auVar85 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar11));
      auVar10 = vfmadd213ps_fma(auVar85,auVar189,ZEXT1632(auVar11));
      auVar85 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar65));
      auVar126 = vfmadd213ps_fma(auVar85,auVar189,ZEXT1632(auVar65));
      auVar85 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar10));
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar85,auVar189);
      fVar213 = auVar85._4_4_ * 3.0;
      local_378._0_4_ = fVar59;
      fVar118 = fVar59 * 0.33333334;
      local_2a8._0_8_ =
           CONCAT44(auVar106._4_4_ + fVar118 * fVar213,
                    auVar106._0_4_ + fVar118 * auVar85._0_4_ * 3.0);
      local_2a8._8_4_ = auVar106._8_4_ + fVar118 * auVar85._8_4_ * 3.0;
      local_2a8._12_4_ = auVar106._12_4_ + fVar118 * auVar85._12_4_ * 3.0;
      auVar10 = vshufpd_avx(auVar106,auVar106,3);
      auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_398 = auVar10;
      auVar126 = vsubps_avx(auVar10,auVar106);
      auVar235 = vsubps_avx(auVar11,(undefined1  [16])0x0);
      auVar75._0_4_ = auVar126._0_4_ + auVar235._0_4_;
      auVar75._4_4_ = auVar126._4_4_ + auVar235._4_4_;
      auVar75._8_4_ = auVar126._8_4_ + auVar235._8_4_;
      auVar75._12_4_ = auVar126._12_4_ + auVar235._12_4_;
      auVar126 = vshufps_avx(auVar106,auVar106,0xb1);
      auVar235 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
      auVar254._4_4_ = auVar75._0_4_;
      auVar254._0_4_ = auVar75._0_4_;
      auVar254._8_4_ = auVar75._0_4_;
      auVar254._12_4_ = auVar75._0_4_;
      auVar65 = vshufps_avx(auVar75,auVar75,0x55);
      fVar89 = auVar65._0_4_;
      auVar76._0_4_ = fVar89 * auVar126._0_4_;
      fVar60 = auVar65._4_4_;
      auVar76._4_4_ = fVar60 * auVar126._4_4_;
      fVar61 = auVar65._8_4_;
      auVar76._8_4_ = fVar61 * auVar126._8_4_;
      fVar144 = auVar65._12_4_;
      auVar76._12_4_ = fVar144 * auVar126._12_4_;
      auVar150._0_4_ = fVar89 * auVar235._0_4_;
      auVar150._4_4_ = fVar60 * auVar235._4_4_;
      auVar150._8_4_ = fVar61 * auVar235._8_4_;
      auVar150._12_4_ = fVar144 * auVar235._12_4_;
      auVar64 = vfmadd231ps_fma(auVar76,auVar254,auVar106);
      auVar228 = vfmadd231ps_fma(auVar150,auVar254,local_2a8._0_16_);
      auVar235 = vshufps_avx(auVar64,auVar64,0xe8);
      auVar65 = vshufps_avx(auVar228,auVar228,0xe8);
      auVar126 = vcmpps_avx(auVar235,auVar65,1);
      uVar55 = vextractps_avx(auVar126,0);
      auVar63 = auVar228;
      if ((uVar55 & 1) == 0) {
        auVar63 = auVar64;
      }
      auVar122._0_4_ = fVar118 * auVar85._16_4_ * 3.0;
      auVar122._4_4_ = fVar118 * fVar213;
      auVar122._8_4_ = fVar118 * auVar85._24_4_ * 3.0;
      auVar122._12_4_ = fVar118 * auVar212._28_4_;
      auVar62 = vsubps_avx((undefined1  [16])0x0,auVar122);
      auVar123 = vshufps_avx(auVar62,auVar62,0xb1);
      auVar119 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar182._0_4_ = fVar89 * auVar123._0_4_;
      auVar182._4_4_ = fVar60 * auVar123._4_4_;
      auVar182._8_4_ = fVar61 * auVar123._8_4_;
      auVar182._12_4_ = fVar144 * auVar123._12_4_;
      auVar195._0_4_ = auVar119._0_4_ * fVar89;
      auVar195._4_4_ = auVar119._4_4_ * fVar60;
      auVar195._8_4_ = auVar119._8_4_ * fVar61;
      auVar195._12_4_ = auVar119._12_4_ * fVar144;
      _local_308 = auVar62;
      auVar91 = vfmadd231ps_fma(auVar182,auVar254,auVar62);
      auVar145 = vfmadd231ps_fma(auVar195,(undefined1  [16])0x0,auVar254);
      auVar119 = vshufps_avx(auVar91,auVar91,0xe8);
      auVar132 = vshufps_avx(auVar145,auVar145,0xe8);
      auVar212 = ZEXT1664(auVar132);
      auVar123 = vcmpps_avx(auVar119,auVar132,1);
      uVar55 = vextractps_avx(auVar123,0);
      auVar161 = auVar145;
      if ((uVar55 & 1) == 0) {
        auVar161 = auVar91;
      }
      auVar63 = vmaxss_avx(auVar161,auVar63);
      auVar235 = vminps_avx(auVar235,auVar65);
      auVar65 = vminps_avx(auVar119,auVar132);
      auVar65 = vminps_avx(auVar235,auVar65);
      auVar126 = vshufps_avx(auVar126,auVar126,0x55);
      auVar126 = vblendps_avx(auVar126,auVar123,2);
      auVar123 = vpslld_avx(auVar126,0x1f);
      auVar126 = vshufpd_avx(auVar228,auVar228,1);
      auVar126 = vinsertps_avx(auVar126,auVar145,0x9c);
      auVar235 = vshufpd_avx(auVar64,auVar64,1);
      auVar235 = vinsertps_avx(auVar235,auVar91,0x9c);
      auVar126 = vblendvps_avx(auVar235,auVar126,auVar123);
      auVar235 = vmovshdup_avx(auVar126);
      auVar126 = vmaxss_avx(auVar235,auVar126);
      fVar61 = auVar65._0_4_;
      auVar235 = vmovshdup_avx(auVar65);
      fVar60 = auVar126._0_4_;
      fVar118 = auVar235._0_4_;
      fVar89 = auVar63._0_4_;
      if (((0.0001 <= fVar61) || (fVar60 <= -0.0001)) && (0.0001 <= fVar118 || fVar60 <= -0.0001))
      goto code_r0x01107073;
      goto LAB_0110709a;
    }
    local_238 = vinsertps_avx(auVar9,auVar12,0x10);
    goto LAB_011067b7;
  }
  if (bVar58) goto LAB_01107b8e;
  fVar59 = ray->tfar;
  auVar84._4_4_ = fVar59;
  auVar84._0_4_ = fVar59;
  auVar84._8_4_ = fVar59;
  auVar84._12_4_ = fVar59;
  auVar9 = vcmpps_avx(local_248,auVar84,2);
  uVar55 = vmovmskps_avx(auVar9);
  uVar48 = (ulong)((uint)uVar54 & uVar55);
  goto LAB_01106077;
code_r0x01107073:
  auVar235 = vcmpps_avx(auVar235,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar64 = vcmpps_avx(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar235 = vandps_avx(auVar64,auVar235);
  if (fVar89 <= -0.0001 || (auVar235 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01106d66;
LAB_0110709a:
  auVar64 = vcmpps_avx(auVar65,_DAT_01f45a50,1);
  auVar228 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar235 = vcmpss_avx(auVar63,ZEXT816(0) << 0x20,1);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = 0x3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar109._8_4_ = 0xbf800000;
  auVar109._0_8_ = 0xbf800000bf800000;
  auVar109._12_4_ = 0xbf800000;
  auVar235 = vblendvps_avx(auVar95,auVar109,auVar235);
  auVar64 = vblendvps_avx(auVar95,auVar109,auVar64);
  fVar213 = auVar64._0_4_;
  fVar144 = auVar235._0_4_;
  auVar235 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar213 == fVar144) && (!NAN(fVar213) && !NAN(fVar144))) {
    auVar235 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar213 == fVar144) && (!NAN(fVar213) && !NAN(fVar144))) {
    auVar228 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar64 = vmovshdup_avx(auVar64);
  fVar117 = auVar64._0_4_;
  if ((fVar213 != fVar117) || (NAN(fVar213) || NAN(fVar117))) {
    if ((fVar118 != fVar61) || (NAN(fVar118) || NAN(fVar61))) {
      auVar124._0_4_ = (float)((uint)fVar61 ^ local_328);
      auVar124._4_4_ = auVar65._4_4_ ^ uStack_324;
      auVar124._8_4_ = auVar65._8_4_ ^ uStack_320;
      auVar124._12_4_ = auVar65._12_4_ ^ uStack_31c;
      auVar125._0_4_ = auVar124._0_4_ / (fVar118 - fVar61);
      auVar125._4_12_ = auVar124._4_12_;
      auVar65 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar125._0_4_)),auVar125,ZEXT416(0));
      auVar64 = auVar65;
    }
    else {
      auVar65 = ZEXT816(0) << 0x20;
      if ((fVar61 != 0.0) || (auVar64 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar61))) {
        auVar65 = SUB6416(ZEXT464(0x7f800000),0);
        auVar64 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar235 = vminss_avx(auVar235,auVar65);
    auVar228 = vmaxss_avx(auVar64,auVar228);
  }
  auVar126 = vcmpss_avx(auVar126,ZEXT416(0),1);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar110._8_4_ = 0xbf800000;
  auVar110._0_8_ = 0xbf800000bf800000;
  auVar110._12_4_ = 0xbf800000;
  auVar126 = vblendvps_avx(auVar96,auVar110,auVar126);
  fVar118 = auVar126._0_4_;
  if ((fVar144 != fVar118) || (NAN(fVar144) || NAN(fVar118))) {
    if ((fVar60 != fVar89) || (NAN(fVar60) || NAN(fVar89))) {
      auVar77._0_4_ = (float)((uint)fVar89 ^ local_328);
      auVar77._4_4_ = auVar63._4_4_ ^ uStack_324;
      auVar77._8_4_ = auVar63._8_4_ ^ uStack_320;
      auVar77._12_4_ = auVar63._12_4_ ^ uStack_31c;
      auVar127._0_4_ = auVar77._0_4_ / (fVar60 - fVar89);
      auVar127._4_12_ = auVar77._4_12_;
      auVar126 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar127,ZEXT416(0));
      auVar65 = auVar126;
    }
    else {
      auVar126 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar89 != 0.0) || (auVar65 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar89))) {
        auVar126 = SUB6416(ZEXT464(0xff800000),0);
        auVar65 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar235 = vminss_avx(auVar235,auVar65);
    auVar228 = vmaxss_avx(auVar126,auVar228);
  }
  if ((fVar117 != fVar118) || (NAN(fVar117) || NAN(fVar118))) {
    auVar235 = vminss_avx(auVar235,SUB6416(ZEXT464(0x3f800000),0));
    auVar228 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar228);
  }
  auVar126 = vmaxss_avx(ZEXT816(0) << 0x40,auVar235);
  auVar235 = vminss_avx(auVar228,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar235._0_4_ < auVar126._0_4_) goto LAB_01106d66;
  auVar126 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar126._0_4_ + -0.1)));
  auVar235 = vminss_avx(ZEXT416((uint)(auVar235._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar138._0_8_ = auVar106._0_8_;
  auVar138._8_8_ = auVar138._0_8_;
  auVar204._8_8_ = local_2a8._0_8_;
  auVar204._0_8_ = local_2a8._0_8_;
  auVar218._8_8_ = auVar62._0_8_;
  auVar218._0_8_ = auVar62._0_8_;
  auVar65 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
  auVar64 = vshufpd_avx(auVar62,auVar62,3);
  auVar228 = vshufps_avx(auVar126,auVar235,0);
  auVar78._8_4_ = 0x3f800000;
  auVar78._0_8_ = 0x3f8000003f800000;
  auVar78._12_4_ = 0x3f800000;
  auVar106 = vsubps_avx(auVar78,auVar228);
  local_398._0_4_ = auVar10._0_4_;
  local_398._4_4_ = auVar10._4_4_;
  fStack_390 = auVar10._8_4_;
  fStack_38c = auVar10._12_4_;
  fVar118 = auVar228._0_4_;
  auVar79._0_4_ = fVar118 * (float)local_398._0_4_;
  fVar89 = auVar228._4_4_;
  auVar79._4_4_ = fVar89 * (float)local_398._4_4_;
  fVar60 = auVar228._8_4_;
  auVar79._8_4_ = fVar60 * fStack_390;
  fVar61 = auVar228._12_4_;
  auVar79._12_4_ = fVar61 * fStack_38c;
  auVar174._0_4_ = fVar118 * auVar65._0_4_;
  auVar174._4_4_ = fVar89 * auVar65._4_4_;
  auVar174._8_4_ = fVar60 * auVar65._8_4_;
  auVar174._12_4_ = fVar61 * auVar65._12_4_;
  auVar183._0_4_ = fVar118 * auVar64._0_4_;
  auVar183._4_4_ = fVar89 * auVar64._4_4_;
  auVar183._8_4_ = fVar60 * auVar64._8_4_;
  auVar183._12_4_ = fVar61 * auVar64._12_4_;
  auVar196._0_4_ = fVar118 * auVar11._0_4_;
  auVar196._4_4_ = fVar89 * auVar11._4_4_;
  auVar196._8_4_ = fVar60 * auVar11._8_4_;
  auVar196._12_4_ = fVar61 * auVar11._12_4_;
  auVar65 = vfmadd231ps_fma(auVar79,auVar106,auVar138);
  auVar64 = vfmadd231ps_fma(auVar174,auVar106,auVar204);
  auVar228 = vfmadd231ps_fma(auVar183,auVar106,auVar218);
  auVar106 = vfmadd231ps_fma(auVar196,auVar106,ZEXT816(0));
  auVar10 = vmovshdup_avx(auVar72);
  auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar126._0_4_)),auVar72,
                            ZEXT416((uint)(1.0 - auVar126._0_4_)));
  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar235._0_4_)),auVar72,
                            ZEXT416((uint)(1.0 - auVar235._0_4_)));
  fVar118 = 1.0 / fVar59;
  auVar126 = vsubps_avx(auVar64,auVar65);
  auVar205._0_4_ = auVar126._0_4_ * 3.0;
  auVar205._4_4_ = auVar126._4_4_ * 3.0;
  auVar205._8_4_ = auVar126._8_4_ * 3.0;
  auVar205._12_4_ = auVar126._12_4_ * 3.0;
  auVar126 = vsubps_avx(auVar228,auVar64);
  auVar219._0_4_ = auVar126._0_4_ * 3.0;
  auVar219._4_4_ = auVar126._4_4_ * 3.0;
  auVar219._8_4_ = auVar126._8_4_ * 3.0;
  auVar219._12_4_ = auVar126._12_4_ * 3.0;
  auVar126 = vsubps_avx(auVar106,auVar228);
  auVar229._0_4_ = auVar126._0_4_ * 3.0;
  auVar229._4_4_ = auVar126._4_4_ * 3.0;
  auVar229._8_4_ = auVar126._8_4_ * 3.0;
  auVar229._12_4_ = auVar126._12_4_ * 3.0;
  auVar10 = vminps_avx(auVar219,auVar229);
  auVar126 = vmaxps_avx(auVar219,auVar229);
  auVar10 = vminps_avx(auVar205,auVar10);
  auVar126 = vmaxps_avx(auVar205,auVar126);
  auVar11 = vshufpd_avx(auVar10,auVar10,3);
  auVar235 = vshufpd_avx(auVar126,auVar126,3);
  auVar10 = vminps_avx(auVar10,auVar11);
  auVar126 = vmaxps_avx(auVar126,auVar235);
  auVar220._0_4_ = auVar10._0_4_ * fVar118;
  auVar220._4_4_ = auVar10._4_4_ * fVar118;
  auVar220._8_4_ = auVar10._8_4_ * fVar118;
  auVar220._12_4_ = auVar10._12_4_ * fVar118;
  auVar206._0_4_ = auVar126._0_4_ * fVar118;
  auVar206._4_4_ = auVar126._4_4_ * fVar118;
  auVar206._8_4_ = auVar126._8_4_ * fVar118;
  auVar206._12_4_ = auVar126._12_4_ * fVar118;
  fVar118 = 1.0 / (auVar91._0_4_ - auVar62._0_4_);
  auVar126 = vshufpd_avx(auVar65,auVar65,3);
  auVar10 = vshufpd_avx(auVar64,auVar64,3);
  auVar11 = vshufpd_avx(auVar228,auVar228,3);
  auVar235 = vshufpd_avx(auVar106,auVar106,3);
  auVar126 = vsubps_avx(auVar126,auVar65);
  auVar65 = vsubps_avx(auVar10,auVar64);
  auVar64 = vsubps_avx(auVar11,auVar228);
  auVar235 = vsubps_avx(auVar235,auVar106);
  auVar10 = vminps_avx(auVar126,auVar65);
  auVar126 = vmaxps_avx(auVar126,auVar65);
  auVar11 = vminps_avx(auVar64,auVar235);
  auVar11 = vminps_avx(auVar10,auVar11);
  auVar10 = vmaxps_avx(auVar64,auVar235);
  auVar126 = vmaxps_avx(auVar126,auVar10);
  auVar246._0_4_ = fVar118 * auVar11._0_4_;
  auVar246._4_4_ = fVar118 * auVar11._4_4_;
  auVar246._8_4_ = fVar118 * auVar11._8_4_;
  auVar246._12_4_ = fVar118 * auVar11._12_4_;
  auVar236._0_4_ = fVar118 * auVar126._0_4_;
  auVar236._4_4_ = fVar118 * auVar126._4_4_;
  auVar236._8_4_ = fVar118 * auVar126._8_4_;
  auVar236._12_4_ = fVar118 * auVar126._12_4_;
  auVar235 = vinsertps_avx(auVar9,auVar62,0x10);
  auVar65 = vinsertps_avx(auVar12,auVar91,0x10);
  auVar230._0_4_ = (auVar235._0_4_ + auVar65._0_4_) * 0.5;
  auVar230._4_4_ = (auVar235._4_4_ + auVar65._4_4_) * 0.5;
  auVar230._8_4_ = (auVar235._8_4_ + auVar65._8_4_) * 0.5;
  auVar230._12_4_ = (auVar235._12_4_ + auVar65._12_4_) * 0.5;
  auVar80._4_4_ = auVar230._0_4_;
  auVar80._0_4_ = auVar230._0_4_;
  auVar80._8_4_ = auVar230._0_4_;
  auVar80._12_4_ = auVar230._0_4_;
  auVar126 = vfmadd213ps_fma(local_1e8,auVar80,local_4e8);
  auVar10 = vfmadd213ps_fma(local_1f8,auVar80,local_4f8);
  auVar11 = vfmadd213ps_fma(local_208,auVar80,local_508);
  auVar12 = vsubps_avx(auVar10,auVar126);
  auVar126 = vfmadd213ps_fma(auVar12,auVar80,auVar126);
  auVar12 = vsubps_avx(auVar11,auVar10);
  auVar12 = vfmadd213ps_fma(auVar12,auVar80,auVar10);
  auVar12 = vsubps_avx(auVar12,auVar126);
  auVar126 = vfmadd231ps_fma(auVar126,auVar12,auVar80);
  auVar81._0_8_ = CONCAT44(auVar12._4_4_ * 3.0,auVar12._0_4_ * 3.0);
  auVar81._8_4_ = auVar12._8_4_ * 3.0;
  auVar81._12_4_ = auVar12._12_4_ * 3.0;
  auVar255._8_8_ = auVar126._0_8_;
  auVar255._0_8_ = auVar126._0_8_;
  auVar12 = vshufpd_avx(auVar126,auVar126,3);
  auVar126 = vshufps_avx(auVar230,auVar230,0x55);
  auVar228 = vsubps_avx(auVar12,auVar255);
  auVar63 = vfmadd231ps_fma(auVar255,auVar126,auVar228);
  auVar260._8_8_ = auVar81._0_8_;
  auVar260._0_8_ = auVar81._0_8_;
  auVar12 = vshufpd_avx(auVar81,auVar81,3);
  auVar12 = vsubps_avx(auVar12,auVar260);
  auVar106 = vfmadd213ps_fma(auVar12,auVar126,auVar260);
  auVar126 = vmovshdup_avx(auVar106);
  auVar261._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
  auVar261._8_4_ = auVar126._8_4_ ^ 0x80000000;
  auVar261._12_4_ = auVar126._12_4_ ^ 0x80000000;
  auVar10 = vmovshdup_avx(auVar228);
  auVar12 = vunpcklps_avx(auVar10,auVar261);
  auVar11 = vshufps_avx(auVar12,auVar261,4);
  auVar64 = vshufps_avx(auVar230,auVar230,0x54);
  auVar128._0_8_ = auVar228._0_8_ ^ 0x8000000080000000;
  auVar128._8_4_ = auVar228._8_4_ ^ 0x80000000;
  auVar128._12_4_ = auVar228._12_4_ ^ 0x80000000;
  auVar12 = vmovlhps_avx(auVar128,auVar106);
  auVar12 = vshufps_avx(auVar12,auVar106,8);
  auVar126 = vfmsub231ss_fma(ZEXT416((uint)(auVar228._0_4_ * auVar126._0_4_)),auVar10,auVar106);
  uVar57 = auVar126._0_4_;
  auVar82._4_4_ = uVar57;
  auVar82._0_4_ = uVar57;
  auVar82._8_4_ = uVar57;
  auVar82._12_4_ = uVar57;
  auVar126 = vdivps_avx(auVar11,auVar82);
  auVar10 = vdivps_avx(auVar12,auVar82);
  fVar60 = auVar63._0_4_;
  fVar118 = auVar126._0_4_;
  auVar12 = vshufps_avx(auVar63,auVar63,0x55);
  fVar89 = auVar10._0_4_;
  auVar83._0_4_ = fVar60 * fVar118 + auVar12._0_4_ * fVar89;
  auVar83._4_4_ = fVar60 * auVar126._4_4_ + auVar12._4_4_ * auVar10._4_4_;
  auVar83._8_4_ = fVar60 * auVar126._8_4_ + auVar12._8_4_ * auVar10._8_4_;
  auVar83._12_4_ = fVar60 * auVar126._12_4_ + auVar12._12_4_ * auVar10._12_4_;
  auVar132 = vsubps_avx(auVar64,auVar83);
  auVar64 = vmovshdup_avx(auVar126);
  auVar12 = vinsertps_avx(auVar220,auVar246,0x1c);
  auVar151._0_4_ = auVar64._0_4_ * auVar12._0_4_;
  auVar151._4_4_ = auVar64._4_4_ * auVar12._4_4_;
  auVar151._8_4_ = auVar64._8_4_ * auVar12._8_4_;
  auVar151._12_4_ = auVar64._12_4_ * auVar12._12_4_;
  auVar11 = vinsertps_avx(auVar206,auVar236,0x1c);
  auVar97._0_4_ = auVar11._0_4_ * auVar64._0_4_;
  auVar97._4_4_ = auVar11._4_4_ * auVar64._4_4_;
  auVar97._8_4_ = auVar11._8_4_ * auVar64._8_4_;
  auVar97._12_4_ = auVar11._12_4_ * auVar64._12_4_;
  auVar63 = vminps_avx(auVar151,auVar97);
  auVar106 = vmaxps_avx(auVar97,auVar151);
  auVar64 = vinsertps_avx(auVar246,auVar220,0x4c);
  auVar123 = vmovshdup_avx(auVar10);
  auVar228 = vinsertps_avx(auVar236,auVar206,0x4c);
  auVar237._0_4_ = auVar123._0_4_ * auVar64._0_4_;
  auVar237._4_4_ = auVar123._4_4_ * auVar64._4_4_;
  auVar237._8_4_ = auVar123._8_4_ * auVar64._8_4_;
  auVar237._12_4_ = auVar123._12_4_ * auVar64._12_4_;
  auVar221._0_4_ = auVar123._0_4_ * auVar228._0_4_;
  auVar221._4_4_ = auVar123._4_4_ * auVar228._4_4_;
  auVar221._8_4_ = auVar123._8_4_ * auVar228._8_4_;
  auVar221._12_4_ = auVar123._12_4_ * auVar228._12_4_;
  auVar123 = vminps_avx(auVar237,auVar221);
  auVar247._0_4_ = auVar63._0_4_ + auVar123._0_4_;
  auVar247._4_4_ = auVar63._4_4_ + auVar123._4_4_;
  auVar247._8_4_ = auVar63._8_4_ + auVar123._8_4_;
  auVar247._12_4_ = auVar63._12_4_ + auVar123._12_4_;
  auVar63 = vmaxps_avx(auVar221,auVar237);
  auVar98._0_4_ = auVar63._0_4_ + auVar106._0_4_;
  auVar98._4_4_ = auVar63._4_4_ + auVar106._4_4_;
  auVar98._8_4_ = auVar63._8_4_ + auVar106._8_4_;
  auVar98._12_4_ = auVar63._12_4_ + auVar106._12_4_;
  auVar222._8_8_ = 0x3f80000000000000;
  auVar222._0_8_ = 0x3f80000000000000;
  auVar106 = vsubps_avx(auVar222,auVar98);
  auVar63 = vsubps_avx(auVar222,auVar247);
  auVar123 = vsubps_avx(auVar235,auVar230);
  auVar119 = vsubps_avx(auVar65,auVar230);
  auVar111._0_4_ = fVar118 * auVar12._0_4_;
  auVar111._4_4_ = fVar118 * auVar12._4_4_;
  auVar111._8_4_ = fVar118 * auVar12._8_4_;
  auVar111._12_4_ = fVar118 * auVar12._12_4_;
  auVar248._0_4_ = fVar118 * auVar11._0_4_;
  auVar248._4_4_ = fVar118 * auVar11._4_4_;
  auVar248._8_4_ = fVar118 * auVar11._8_4_;
  auVar248._12_4_ = fVar118 * auVar11._12_4_;
  auVar11 = vminps_avx(auVar111,auVar248);
  auVar12 = vmaxps_avx(auVar248,auVar111);
  auVar152._0_4_ = fVar89 * auVar64._0_4_;
  auVar152._4_4_ = fVar89 * auVar64._4_4_;
  auVar152._8_4_ = fVar89 * auVar64._8_4_;
  auVar152._12_4_ = fVar89 * auVar64._12_4_;
  auVar207._0_4_ = fVar89 * auVar228._0_4_;
  auVar207._4_4_ = fVar89 * auVar228._4_4_;
  auVar207._8_4_ = fVar89 * auVar228._8_4_;
  auVar207._12_4_ = fVar89 * auVar228._12_4_;
  auVar64 = vminps_avx(auVar152,auVar207);
  auVar249._0_4_ = auVar11._0_4_ + auVar64._0_4_;
  auVar249._4_4_ = auVar11._4_4_ + auVar64._4_4_;
  auVar249._8_4_ = auVar11._8_4_ + auVar64._8_4_;
  auVar249._12_4_ = auVar11._12_4_ + auVar64._12_4_;
  fVar117 = auVar123._0_4_;
  auVar256._0_4_ = fVar117 * auVar106._0_4_;
  fVar177 = auVar123._4_4_;
  auVar256._4_4_ = fVar177 * auVar106._4_4_;
  fVar190 = auVar123._8_4_;
  auVar256._8_4_ = fVar190 * auVar106._8_4_;
  fVar191 = auVar123._12_4_;
  auVar256._12_4_ = fVar191 * auVar106._12_4_;
  auVar11 = vmaxps_avx(auVar207,auVar152);
  auVar208._0_4_ = fVar117 * auVar63._0_4_;
  auVar208._4_4_ = fVar177 * auVar63._4_4_;
  auVar208._8_4_ = fVar190 * auVar63._8_4_;
  auVar208._12_4_ = fVar191 * auVar63._12_4_;
  fVar60 = auVar119._0_4_;
  auVar99._0_4_ = fVar60 * auVar106._0_4_;
  fVar61 = auVar119._4_4_;
  auVar99._4_4_ = fVar61 * auVar106._4_4_;
  fVar144 = auVar119._8_4_;
  auVar99._8_4_ = fVar144 * auVar106._8_4_;
  fVar213 = auVar119._12_4_;
  auVar99._12_4_ = fVar213 * auVar106._12_4_;
  auVar223._0_4_ = fVar60 * auVar63._0_4_;
  auVar223._4_4_ = fVar61 * auVar63._4_4_;
  auVar223._8_4_ = fVar144 * auVar63._8_4_;
  auVar223._12_4_ = fVar213 * auVar63._12_4_;
  auVar112._0_4_ = auVar12._0_4_ + auVar11._0_4_;
  auVar112._4_4_ = auVar12._4_4_ + auVar11._4_4_;
  auVar112._8_4_ = auVar12._8_4_ + auVar11._8_4_;
  auVar112._12_4_ = auVar12._12_4_ + auVar11._12_4_;
  auVar153._8_8_ = 0x3f800000;
  auVar153._0_8_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar153,auVar112);
  auVar11 = vsubps_avx(auVar153,auVar249);
  auVar250._0_4_ = fVar117 * auVar12._0_4_;
  auVar250._4_4_ = fVar177 * auVar12._4_4_;
  auVar250._8_4_ = fVar190 * auVar12._8_4_;
  auVar250._12_4_ = fVar191 * auVar12._12_4_;
  auVar238._0_4_ = fVar117 * auVar11._0_4_;
  auVar238._4_4_ = fVar177 * auVar11._4_4_;
  auVar238._8_4_ = fVar190 * auVar11._8_4_;
  auVar238._12_4_ = fVar191 * auVar11._12_4_;
  auVar113._0_4_ = fVar60 * auVar12._0_4_;
  auVar113._4_4_ = fVar61 * auVar12._4_4_;
  auVar113._8_4_ = fVar144 * auVar12._8_4_;
  auVar113._12_4_ = fVar213 * auVar12._12_4_;
  auVar154._0_4_ = fVar60 * auVar11._0_4_;
  auVar154._4_4_ = fVar61 * auVar11._4_4_;
  auVar154._8_4_ = fVar144 * auVar11._8_4_;
  auVar154._12_4_ = fVar213 * auVar11._12_4_;
  auVar12 = vminps_avx(auVar250,auVar238);
  auVar11 = vminps_avx(auVar113,auVar154);
  auVar12 = vminps_avx(auVar12,auVar11);
  auVar11 = vmaxps_avx(auVar238,auVar250);
  auVar64 = vmaxps_avx(auVar154,auVar113);
  auVar228 = vminps_avx(auVar256,auVar208);
  auVar106 = vminps_avx(auVar99,auVar223);
  auVar228 = vminps_avx(auVar228,auVar106);
  auVar12 = vhaddps_avx(auVar12,auVar228);
  auVar11 = vmaxps_avx(auVar64,auVar11);
  auVar64 = vmaxps_avx(auVar208,auVar256);
  auVar228 = vmaxps_avx(auVar223,auVar99);
  auVar64 = vmaxps_avx(auVar228,auVar64);
  auVar11 = vhaddps_avx(auVar11,auVar64);
  auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
  auVar11 = vshufps_avx(auVar11,auVar11,0xe8);
  auVar224._0_4_ = auVar132._0_4_ + auVar12._0_4_;
  auVar224._4_4_ = auVar132._4_4_ + auVar12._4_4_;
  auVar224._8_4_ = auVar132._8_4_ + auVar12._8_4_;
  auVar224._12_4_ = auVar132._12_4_ + auVar12._12_4_;
  auVar209._0_4_ = auVar132._0_4_ + auVar11._0_4_;
  auVar209._4_4_ = auVar132._4_4_ + auVar11._4_4_;
  auVar209._8_4_ = auVar132._8_4_ + auVar11._8_4_;
  auVar209._12_4_ = auVar132._12_4_ + auVar11._12_4_;
  auVar212 = ZEXT1664(auVar209);
  auVar12 = vmaxps_avx(auVar235,auVar224);
  auVar11 = vminps_avx(auVar209,auVar65);
  auVar12 = vcmpps_avx(auVar11,auVar12,1);
  auVar12 = vshufps_avx(auVar12,auVar12,0x50);
  if ((auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar12[0xf] < '\0')
  goto LAB_01106d66;
  bVar51 = 0;
  if ((auVar189._0_4_ < auVar224._0_4_) && (bVar51 = 0, auVar209._0_4_ < auVar65._0_4_)) {
    auVar11 = vmovshdup_avx(auVar224);
    auVar12 = vcmpps_avx(auVar209,auVar65,1);
    bVar51 = auVar12[4] & auVar62._0_4_ < auVar11._0_4_;
  }
  auVar212 = ZEXT464(0x40400000);
  if (((3 < (uint)uVar53 || fVar59 < 0.001) | bVar51) != 1) goto LAB_01107b4a;
  lVar50 = 0xc9;
  do {
    lVar50 = lVar50 + -1;
    if (lVar50 == 0) goto LAB_01106d66;
    fVar61 = auVar132._0_4_;
    fVar60 = 1.0 - fVar61;
    fVar59 = fVar60 * fVar60 * fVar60;
    fVar88 = fVar61 * 3.0 * fVar60 * fVar60;
    fVar60 = fVar60 * fVar61 * fVar61 * 3.0;
    auVar139._4_4_ = fVar59;
    auVar139._0_4_ = fVar59;
    auVar139._8_4_ = fVar59;
    auVar139._12_4_ = fVar59;
    auVar114._4_4_ = fVar88;
    auVar114._0_4_ = fVar88;
    auVar114._8_4_ = fVar88;
    auVar114._12_4_ = fVar88;
    auVar100._4_4_ = fVar60;
    auVar100._0_4_ = fVar60;
    auVar100._8_4_ = fVar60;
    auVar100._12_4_ = fVar60;
    fVar61 = fVar61 * fVar61 * fVar61;
    auVar155._0_4_ = (float)local_218._0_4_ * fVar61;
    auVar155._4_4_ = (float)local_218._4_4_ * fVar61;
    auVar155._8_4_ = fStack_210 * fVar61;
    auVar155._12_4_ = fStack_20c * fVar61;
    auVar9 = vfmadd231ps_fma(auVar155,local_508,auVar100);
    auVar9 = vfmadd231ps_fma(auVar9,local_4f8,auVar114);
    auVar9 = vfmadd231ps_fma(auVar9,local_4e8,auVar139);
    auVar101._8_8_ = auVar9._0_8_;
    auVar101._0_8_ = auVar9._0_8_;
    auVar9 = vshufpd_avx(auVar9,auVar9,3);
    auVar12 = vshufps_avx(auVar132,auVar132,0x55);
    auVar9 = vsubps_avx(auVar9,auVar101);
    auVar12 = vfmadd213ps_fma(auVar9,auVar12,auVar101);
    fVar59 = auVar12._0_4_;
    auVar9 = vshufps_avx(auVar12,auVar12,0x55);
    auVar102._0_4_ = fVar118 * fVar59 + fVar89 * auVar9._0_4_;
    auVar102._4_4_ = auVar126._4_4_ * fVar59 + auVar10._4_4_ * auVar9._4_4_;
    auVar102._8_4_ = auVar126._8_4_ * fVar59 + auVar10._8_4_ * auVar9._8_4_;
    auVar102._12_4_ = auVar126._12_4_ * fVar59 + auVar10._12_4_ * auVar9._12_4_;
    auVar132 = vsubps_avx(auVar132,auVar102);
    auVar9 = vandps_avx(local_318,auVar12);
    auVar12 = vshufps_avx(auVar9,auVar9,0xf5);
    auVar9 = vmaxss_avx(auVar12,auVar9);
  } while ((float)local_228._0_4_ <= auVar9._0_4_);
  fVar59 = auVar132._0_4_;
  if ((fVar59 < 0.0) || (1.0 < fVar59)) goto LAB_01106d66;
  auVar9 = vmovshdup_avx(auVar132);
  fVar88 = auVar9._0_4_;
  if ((fVar88 < 0.0) || (1.0 < fVar88)) goto LAB_01106d66;
  auVar9 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                         ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar64 = vinsertps_avx(auVar9,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar1 = (ray->org).field_0;
  auVar9 = vsubps_avx(local_458,(undefined1  [16])aVar1);
  auVar9 = vdpps_avx(auVar9,auVar64,0x7f);
  auVar12 = vsubps_avx(local_488,(undefined1  [16])aVar1);
  auVar12 = vdpps_avx(auVar12,auVar64,0x7f);
  auVar126 = vsubps_avx(local_498,(undefined1  [16])aVar1);
  auVar126 = vdpps_avx(auVar126,auVar64,0x7f);
  auVar10 = vsubps_avx(local_478,(undefined1  [16])aVar1);
  auVar10 = vdpps_avx(auVar10,auVar64,0x7f);
  auVar11 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
  auVar11 = vdpps_avx(auVar11,auVar64,0x7f);
  auVar235 = vsubps_avx(_local_4a8,(undefined1  [16])aVar1);
  auVar235 = vdpps_avx(auVar235,auVar64,0x7f);
  auVar65 = vsubps_avx(_local_4b8,(undefined1  [16])aVar1);
  auVar65 = vdpps_avx(auVar65,auVar64,0x7f);
  auVar44._4_4_ = fStack_4c4;
  auVar44._0_4_ = local_4c8;
  auVar44._8_4_ = fStack_4c0;
  auVar44._12_4_ = fStack_4bc;
  auVar228 = vsubps_avx(auVar44,(undefined1  [16])aVar1);
  auVar64 = vdpps_avx(auVar228,auVar64,0x7f);
  fVar118 = 1.0 - fVar88;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar88)),ZEXT416((uint)fVar118),auVar9);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar235._0_4_ * fVar88)),ZEXT416((uint)fVar118),auVar12)
  ;
  auVar126 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar88)),ZEXT416((uint)fVar118),auVar126
                            );
  auVar212 = ZEXT1664(auVar126);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * auVar64._0_4_)),ZEXT416((uint)fVar118),auVar10);
  fVar60 = 1.0 - fVar59;
  fVar88 = fVar60 * fVar59 * fVar59 * 3.0;
  fVar144 = fVar59 * fVar59 * fVar59;
  auVar126 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar144)),ZEXT416((uint)fVar88),auVar126
                            );
  fVar118 = fVar59 * 3.0 * fVar60 * fVar60;
  auVar12 = vfmadd231ss_fma(auVar126,ZEXT416((uint)fVar118),auVar12);
  fVar89 = fVar60 * fVar60 * fVar60;
  auVar9 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar89),auVar9);
  fVar61 = auVar9._0_4_;
  if ((fVar61 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar61)) goto LAB_01106d66;
  pGVar4 = (context->scene->geometries).items[local_4d0].ptr;
  if ((pGVar4->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar51 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01107aef;
    local_528._0_4_ = ray->tfar;
    auVar9 = vshufps_avx(auVar132,auVar132,0x55);
    auVar197._8_4_ = 0x3f800000;
    auVar197._0_8_ = 0x3f8000003f800000;
    auVar197._12_4_ = 0x3f800000;
    auVar12 = vsubps_avx(auVar197,auVar9);
    fVar213 = auVar9._0_4_;
    auVar210._0_4_ = fVar213 * (float)local_468._0_4_;
    fVar117 = auVar9._4_4_;
    auVar210._4_4_ = fVar117 * (float)local_468._4_4_;
    fVar177 = auVar9._8_4_;
    auVar210._8_4_ = fVar177 * fStack_460;
    fVar190 = auVar9._12_4_;
    auVar210._12_4_ = fVar190 * fStack_45c;
    auVar225._0_4_ = fVar213 * (float)local_4a8._0_4_;
    auVar225._4_4_ = fVar117 * (float)local_4a8._4_4_;
    auVar225._8_4_ = fVar177 * fStack_4a0;
    auVar225._12_4_ = fVar190 * fStack_49c;
    auVar231._0_4_ = fVar213 * (float)local_4b8._0_4_;
    auVar231._4_4_ = fVar117 * (float)local_4b8._4_4_;
    auVar231._8_4_ = fVar177 * fStack_4b0;
    auVar231._12_4_ = fVar190 * fStack_4ac;
    auVar184._0_4_ = fVar213 * local_4c8;
    auVar184._4_4_ = fVar117 * fStack_4c4;
    auVar184._8_4_ = fVar177 * fStack_4c0;
    auVar184._12_4_ = fVar190 * fStack_4bc;
    auVar9 = vfmadd231ps_fma(auVar210,auVar12,local_458);
    auVar126 = vfmadd231ps_fma(auVar225,auVar12,local_488);
    auVar10 = vfmadd231ps_fma(auVar231,auVar12,local_498);
    auVar11 = vfmadd231ps_fma(auVar184,auVar12,local_478);
    auVar9 = vsubps_avx(auVar126,auVar9);
    auVar12 = vsubps_avx(auVar10,auVar126);
    auVar212 = ZEXT1664(auVar12);
    auVar126 = vsubps_avx(auVar11,auVar10);
    auVar232._0_4_ = fVar59 * auVar12._0_4_;
    auVar232._4_4_ = fVar59 * auVar12._4_4_;
    auVar232._8_4_ = fVar59 * auVar12._8_4_;
    auVar232._12_4_ = fVar59 * auVar12._12_4_;
    auVar175._4_4_ = fVar60;
    auVar175._0_4_ = fVar60;
    auVar175._8_4_ = fVar60;
    auVar175._12_4_ = fVar60;
    auVar9 = vfmadd231ps_fma(auVar232,auVar175,auVar9);
    auVar185._0_4_ = fVar59 * auVar126._0_4_;
    auVar185._4_4_ = fVar59 * auVar126._4_4_;
    auVar185._8_4_ = fVar59 * auVar126._8_4_;
    auVar185._12_4_ = fVar59 * auVar126._12_4_;
    auVar126 = vfmadd231ps_fma(auVar185,auVar175,auVar12);
    auVar186._0_4_ = fVar59 * auVar126._0_4_;
    auVar186._4_4_ = fVar59 * auVar126._4_4_;
    auVar186._8_4_ = fVar59 * auVar126._8_4_;
    auVar186._12_4_ = fVar59 * auVar126._12_4_;
    auVar126 = vfmadd231ps_fma(auVar186,auVar175,auVar9);
    auVar156._0_4_ = fVar144 * (float)local_288._0_4_;
    auVar156._4_4_ = fVar144 * (float)local_288._4_4_;
    auVar156._8_4_ = fVar144 * fStack_280;
    auVar156._12_4_ = fVar144 * fStack_27c;
    auVar115._4_4_ = fVar88;
    auVar115._0_4_ = fVar88;
    auVar115._8_4_ = fVar88;
    auVar115._12_4_ = fVar88;
    auVar9 = vfmadd132ps_fma(auVar115,auVar156,local_278);
    auVar140._4_4_ = fVar118;
    auVar140._0_4_ = fVar118;
    auVar140._8_4_ = fVar118;
    auVar140._12_4_ = fVar118;
    auVar9 = vfmadd132ps_fma(auVar140,auVar9,local_268);
    auVar116._0_4_ = auVar126._0_4_ * 3.0;
    auVar116._4_4_ = auVar126._4_4_ * 3.0;
    auVar116._8_4_ = auVar126._8_4_ * 3.0;
    auVar116._12_4_ = auVar126._12_4_ * 3.0;
    auVar129._4_4_ = fVar89;
    auVar129._0_4_ = fVar89;
    auVar129._8_4_ = fVar89;
    auVar129._12_4_ = fVar89;
    auVar126 = vfmadd132ps_fma(auVar129,auVar9,local_258);
    auVar9 = vshufps_avx(auVar116,auVar116,0xc9);
    auVar141._0_4_ = auVar126._0_4_ * auVar9._0_4_;
    auVar141._4_4_ = auVar126._4_4_ * auVar9._4_4_;
    auVar141._8_4_ = auVar126._8_4_ * auVar9._8_4_;
    auVar141._12_4_ = auVar126._12_4_ * auVar9._12_4_;
    auVar9 = vshufps_avx(auVar126,auVar126,0xc9);
    auVar126 = vfmsub231ps_fma(auVar141,auVar116,auVar9);
    auVar9 = vshufps_avx(auVar126,auVar126,0xe9);
    local_2d8 = vmovlps_avx(auVar9);
    local_2d0 = auVar126._0_4_;
    local_2cc = vmovlps_avx(auVar132);
    local_2c4 = (int)local_3a8;
    local_2c0 = (int)local_4d0;
    local_2bc = context->user->instID[0];
    local_2b8 = context->user->instPrimID[0];
    ray->tfar = fVar61;
    local_52c = -1;
    local_358.valid = &local_52c;
    local_358.geometryUserPtr = pGVar4->userPtr;
    local_358.context = context->user;
    local_358.hit = (RTCHitN *)&local_2d8;
    local_358.N = 1;
    local_358.ray = (RTCRayN *)ray;
    if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01107a98:
      p_Var5 = context->args->filter;
      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
        auVar212 = ZEXT1664(auVar212._0_16_);
        (*p_Var5)(&local_358);
        if (*local_358.valid == 0) goto LAB_01107ae1;
      }
      bVar51 = 1;
      goto LAB_01107aef;
    }
    auVar212 = ZEXT1664(auVar12);
    (*pGVar4->occlusionFilterN)(&local_358);
    if (*local_358.valid != 0) goto LAB_01107a98;
LAB_01107ae1:
    ray->tfar = (float)local_528._0_4_;
  }
  bVar51 = 0;
LAB_01107aef:
  bVar58 = (bool)(bVar58 | bVar51);
  goto LAB_01106d66;
LAB_01107b4a:
  local_238 = vinsertps_avx(auVar9,ZEXT416((uint)fVar88),0x10);
  auVar72 = vinsertps_avx(auVar62,ZEXT416((uint)auVar91._0_4_),0x10);
  goto LAB_011067b7;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }